

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  BBox1f BVar9;
  Primitive PVar10;
  uint uVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [12];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  uint uVar73;
  long lVar74;
  byte bVar75;
  long lVar76;
  uint uVar77;
  float fVar78;
  float fVar117;
  float fVar118;
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar119;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar94 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar130 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 extraout_var [56];
  vint4 bi;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar198;
  float fVar199;
  vint4 ai_1;
  float fVar200;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar201;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  float fVar202;
  float fVar203;
  float fVar227;
  float fVar229;
  vint4 ai_2;
  undefined1 auVar204 [16];
  float fVar231;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar228;
  float fVar230;
  float fVar232;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar233;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  vint4 ai;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar262 [16];
  vfloat4 b0;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [32];
  float fVar287;
  float fVar298;
  float fVar299;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  float fVar300;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar301;
  float fVar302;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [32];
  float fVar311;
  float fVar321;
  float fVar323;
  undefined1 auVar313 [16];
  float fVar312;
  undefined1 auVar319 [32];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  float fVar322;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar320 [64];
  float fVar327;
  float fVar333;
  float fVar334;
  float fVar335;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar346;
  float fVar347;
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  float fVar348;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  float fVar349;
  vfloat4 a0;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar360;
  float fVar366;
  float fVar367;
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  float fVar369;
  undefined1 auVar363 [16];
  float fVar368;
  undefined1 auVar364 [16];
  undefined1 auVar365 [64];
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_588 [8];
  float fStack_580;
  float fStack_57c;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float fStack_520;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float fStack_500;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_468 [16];
  undefined1 (*local_458) [16];
  Primitive *local_450;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_398;
  undefined8 uStack_390;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  vfloat_impl<4> p03;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  BBox1f cu_stack [4];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar261 [32];
  undefined1 auVar359 [32];
  
  PVar10 = prim[1];
  uVar72 = (ulong)(byte)PVar10;
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 4 + 6)));
  lVar74 = uVar72 * 0x25;
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 5 + 6)));
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 6 + 6)));
  auVar288 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0xf + 6)));
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x11 + 6)));
  auVar80 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1a + 6)));
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1b + 6)));
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar72 * 0x1c + 6)));
  auVar161 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar161 = vinsertps_avx(auVar161,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar191 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar191 = vinsertps_avx(auVar191,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar184 = *(float *)(prim + lVar74 + 0x12);
  auVar161 = vsubps_avx(auVar161,*(undefined1 (*) [16])(prim + lVar74 + 6));
  auVar98._0_4_ = fVar184 * auVar161._0_4_;
  auVar98._4_4_ = fVar184 * auVar161._4_4_;
  auVar98._8_4_ = fVar184 * auVar161._8_4_;
  auVar98._12_4_ = fVar184 * auVar161._12_4_;
  auVar350._0_4_ = fVar184 * auVar191._0_4_;
  auVar350._4_4_ = fVar184 * auVar191._4_4_;
  auVar350._8_4_ = fVar184 * auVar191._8_4_;
  auVar350._12_4_ = fVar184 * auVar191._12_4_;
  auVar160 = vcvtdq2ps_avx(auVar23);
  auVar19 = vcvtdq2ps_avx(auVar24);
  auVar20 = vcvtdq2ps_avx(auVar25);
  auVar21 = vcvtdq2ps_avx(auVar288);
  auVar22 = vcvtdq2ps_avx(auVar26);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar161 = vshufps_avx(auVar350,auVar350,0);
  auVar191 = vshufps_avx(auVar350,auVar350,0x55);
  auVar23 = vshufps_avx(auVar350,auVar350,0xaa);
  fVar233 = auVar23._0_4_;
  fVar250 = auVar23._4_4_;
  fVar251 = auVar23._8_4_;
  fVar252 = auVar23._12_4_;
  fVar184 = auVar191._0_4_;
  fVar198 = auVar191._4_4_;
  fVar199 = auVar191._8_4_;
  fVar200 = auVar191._12_4_;
  fVar202 = auVar161._0_4_;
  fVar227 = auVar161._4_4_;
  fVar229 = auVar161._8_4_;
  fVar231 = auVar161._12_4_;
  auVar271._0_4_ = fVar202 * auVar160._0_4_ + auVar19._0_4_ * fVar184 + fVar233 * auVar20._0_4_;
  auVar271._4_4_ = fVar227 * auVar160._4_4_ + auVar19._4_4_ * fVar198 + fVar250 * auVar20._4_4_;
  auVar271._8_4_ = fVar229 * auVar160._8_4_ + auVar19._8_4_ * fVar199 + fVar251 * auVar20._8_4_;
  auVar271._12_4_ = fVar231 * auVar160._12_4_ + auVar19._12_4_ * fVar200 + fVar252 * auVar20._12_4_;
  auVar341._0_4_ = fVar202 * auVar21._0_4_ + fVar184 * auVar22._0_4_ + fVar233 * auVar79._0_4_;
  auVar341._4_4_ = fVar227 * auVar21._4_4_ + fVar198 * auVar22._4_4_ + fVar250 * auVar79._4_4_;
  auVar341._8_4_ = fVar229 * auVar21._8_4_ + fVar199 * auVar22._8_4_ + fVar251 * auVar79._8_4_;
  auVar341._12_4_ = fVar231 * auVar21._12_4_ + fVar200 * auVar22._12_4_ + fVar252 * auVar79._12_4_;
  auVar144._0_4_ = fVar202 * auVar80._0_4_ + fVar233 * auVar121._0_4_ + fVar184 * auVar81._0_4_;
  auVar144._4_4_ = fVar227 * auVar80._4_4_ + fVar250 * auVar121._4_4_ + fVar198 * auVar81._4_4_;
  auVar144._8_4_ = fVar229 * auVar80._8_4_ + fVar251 * auVar121._8_4_ + fVar199 * auVar81._8_4_;
  auVar144._12_4_ = fVar231 * auVar80._12_4_ + fVar252 * auVar121._12_4_ + fVar200 * auVar81._12_4_;
  auVar361._8_4_ = 0x7fffffff;
  auVar361._0_8_ = 0x7fffffff7fffffff;
  auVar361._12_4_ = 0x7fffffff;
  auVar161 = vandps_avx(auVar271,auVar361);
  auVar351._8_4_ = 0x219392ef;
  auVar351._0_8_ = 0x219392ef219392ef;
  auVar351._12_4_ = 0x219392ef;
  auVar161 = vcmpps_avx(auVar161,auVar351,1);
  auVar25 = vblendvps_avx(auVar271,auVar351,auVar161);
  auVar161 = vandps_avx(auVar341,auVar361);
  auVar161 = vcmpps_avx(auVar161,auVar351,1);
  auVar288 = vblendvps_avx(auVar341,auVar351,auVar161);
  auVar161 = vandps_avx(auVar361,auVar144);
  auVar161 = vcmpps_avx(auVar161,auVar351,1);
  auVar26 = vblendvps_avx(auVar144,auVar351,auVar161);
  auVar161 = vshufps_avx(auVar98,auVar98,0x55);
  auVar191 = vshufps_avx(auVar98,auVar98,0xaa);
  fVar233 = auVar191._0_4_;
  fVar250 = auVar191._4_4_;
  fVar251 = auVar191._8_4_;
  fVar252 = auVar191._12_4_;
  fVar202 = auVar161._0_4_;
  fVar227 = auVar161._4_4_;
  fVar229 = auVar161._8_4_;
  fVar231 = auVar161._12_4_;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar72 * 7 + 6);
  auVar161 = vpmovsxwd_avx(auVar161);
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar191 = vpmovsxwd_avx(auVar191);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar72 * 9 + 6);
  auVar23 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar72 * 0xd + 6);
  auVar24 = vpmovsxwd_avx(auVar24);
  auVar120 = vshufps_avx(auVar98,auVar98,0);
  fVar184 = auVar120._0_4_;
  fVar198 = auVar120._4_4_;
  fVar199 = auVar120._8_4_;
  fVar200 = auVar120._12_4_;
  auVar151._0_4_ = fVar202 * auVar19._0_4_ + fVar233 * auVar20._0_4_ + fVar184 * auVar160._0_4_;
  auVar151._4_4_ = fVar227 * auVar19._4_4_ + fVar250 * auVar20._4_4_ + fVar198 * auVar160._4_4_;
  auVar151._8_4_ = fVar229 * auVar19._8_4_ + fVar251 * auVar20._8_4_ + fVar199 * auVar160._8_4_;
  auVar151._12_4_ = fVar231 * auVar19._12_4_ + fVar252 * auVar20._12_4_ + fVar200 * auVar160._12_4_;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar72 * 0x12 + 6);
  auVar160 = vpmovsxwd_avx(auVar160);
  auVar120._0_4_ = fVar233 * auVar79._0_4_ + fVar202 * auVar22._0_4_ + fVar184 * auVar21._0_4_;
  auVar120._4_4_ = fVar250 * auVar79._4_4_ + fVar227 * auVar22._4_4_ + fVar198 * auVar21._4_4_;
  auVar120._8_4_ = fVar251 * auVar79._8_4_ + fVar229 * auVar22._8_4_ + fVar199 * auVar21._8_4_;
  auVar120._12_4_ = fVar252 * auVar79._12_4_ + fVar231 * auVar22._12_4_ + fVar200 * auVar21._12_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar72 * 0x16 + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar79._0_4_ = fVar233 * auVar121._0_4_ + fVar202 * auVar81._0_4_ + fVar184 * auVar80._0_4_;
  auVar79._4_4_ = fVar250 * auVar121._4_4_ + fVar227 * auVar81._4_4_ + fVar198 * auVar80._4_4_;
  auVar79._8_4_ = fVar251 * auVar121._8_4_ + fVar229 * auVar81._8_4_ + fVar199 * auVar80._8_4_;
  auVar79._12_4_ = fVar252 * auVar121._12_4_ + fVar231 * auVar81._12_4_ + fVar200 * auVar80._12_4_;
  auVar20 = vrcpps_avx(auVar25);
  fVar184 = auVar20._0_4_;
  auVar204._0_4_ = auVar25._0_4_ * fVar184;
  fVar198 = auVar20._4_4_;
  auVar204._4_4_ = auVar25._4_4_ * fVar198;
  fVar199 = auVar20._8_4_;
  auVar204._8_4_ = auVar25._8_4_ * fVar199;
  fVar200 = auVar20._12_4_;
  auVar204._12_4_ = auVar25._12_4_ * fVar200;
  auVar272._8_4_ = 0x3f800000;
  auVar272._0_8_ = 0x3f8000003f800000;
  auVar272._12_4_ = 0x3f800000;
  auVar25 = vsubps_avx(auVar272,auVar204);
  fVar184 = fVar184 + fVar184 * auVar25._0_4_;
  fVar198 = fVar198 + fVar198 * auVar25._4_4_;
  fVar199 = fVar199 + fVar199 * auVar25._8_4_;
  fVar200 = fVar200 + fVar200 * auVar25._12_4_;
  auVar25 = vrcpps_avx(auVar288);
  fVar202 = auVar25._0_4_;
  auVar167._0_4_ = fVar202 * auVar288._0_4_;
  fVar227 = auVar25._4_4_;
  auVar167._4_4_ = fVar227 * auVar288._4_4_;
  fVar229 = auVar25._8_4_;
  auVar167._8_4_ = fVar229 * auVar288._8_4_;
  fVar231 = auVar25._12_4_;
  auVar167._12_4_ = fVar231 * auVar288._12_4_;
  auVar25 = vsubps_avx(auVar272,auVar167);
  fVar202 = fVar202 + fVar202 * auVar25._0_4_;
  fVar227 = fVar227 + fVar227 * auVar25._4_4_;
  fVar229 = fVar229 + fVar229 * auVar25._8_4_;
  fVar231 = fVar231 + fVar231 * auVar25._12_4_;
  auVar25 = vrcpps_avx(auVar26);
  fVar233 = auVar25._0_4_;
  auVar132._0_4_ = fVar233 * auVar26._0_4_;
  fVar250 = auVar25._4_4_;
  auVar132._4_4_ = fVar250 * auVar26._4_4_;
  fVar251 = auVar25._8_4_;
  auVar132._8_4_ = fVar251 * auVar26._8_4_;
  fVar252 = auVar25._12_4_;
  auVar132._12_4_ = fVar252 * auVar26._12_4_;
  auVar25 = vsubps_avx(auVar272,auVar132);
  fVar233 = fVar233 + fVar233 * auVar25._0_4_;
  fVar250 = fVar250 + fVar250 * auVar25._4_4_;
  fVar251 = fVar251 + fVar251 * auVar25._8_4_;
  fVar252 = fVar252 + fVar252 * auVar25._12_4_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar72 * 0x14 + 6);
  auVar25 = vpmovsxwd_avx(auVar25);
  auVar288 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar74 + 0x16)) *
                           *(float *)(prim + lVar74 + 0x1a)));
  auVar288 = vshufps_avx(auVar288,auVar288,0);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar191 = vsubps_avx(auVar191,auVar161);
  fVar201 = auVar288._0_4_;
  fVar203 = auVar288._4_4_;
  fVar228 = auVar288._8_4_;
  fVar230 = auVar288._12_4_;
  auVar133._0_4_ = fVar201 * auVar191._0_4_ + auVar161._0_4_;
  auVar133._4_4_ = fVar203 * auVar191._4_4_ + auVar161._4_4_;
  auVar133._8_4_ = fVar228 * auVar191._8_4_ + auVar161._8_4_;
  auVar133._12_4_ = fVar230 * auVar191._12_4_ + auVar161._12_4_;
  auVar161 = vcvtdq2ps_avx(auVar23);
  auVar191 = vcvtdq2ps_avx(auVar24);
  auVar191 = vsubps_avx(auVar191,auVar161);
  auVar263._0_4_ = fVar201 * auVar191._0_4_ + auVar161._0_4_;
  auVar263._4_4_ = fVar203 * auVar191._4_4_ + auVar161._4_4_;
  auVar263._8_4_ = fVar228 * auVar191._8_4_ + auVar161._8_4_;
  auVar263._12_4_ = fVar230 * auVar191._12_4_ + auVar161._12_4_;
  auVar161 = vcvtdq2ps_avx(auVar160);
  auVar191 = vcvtdq2ps_avx(auVar19);
  auVar191 = vsubps_avx(auVar191,auVar161);
  auVar342._0_4_ = fVar201 * auVar191._0_4_ + auVar161._0_4_;
  auVar342._4_4_ = fVar203 * auVar191._4_4_ + auVar161._4_4_;
  auVar342._8_4_ = fVar228 * auVar191._8_4_ + auVar161._8_4_;
  auVar342._12_4_ = fVar230 * auVar191._12_4_ + auVar161._12_4_;
  auVar161 = vcvtdq2ps_avx(auVar25);
  auVar288._8_8_ = 0;
  auVar288._0_8_ = *(ulong *)(prim + uVar72 * 0x18 + 6);
  auVar191 = vpmovsxwd_avx(auVar288);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar191 = vsubps_avx(auVar191,auVar161);
  auVar289._0_4_ = fVar201 * auVar191._0_4_ + auVar161._0_4_;
  auVar289._4_4_ = fVar203 * auVar191._4_4_ + auVar161._4_4_;
  auVar289._8_4_ = fVar228 * auVar191._8_4_ + auVar161._8_4_;
  auVar289._12_4_ = fVar230 * auVar191._12_4_ + auVar161._12_4_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar72 * 0x1d + 6);
  auVar161 = vpmovsxwd_avx(auVar26);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar72 * 0x21 + 6);
  auVar191 = vpmovsxwd_avx(auVar20);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar23 = vsubps_avx(auVar191,auVar161);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar72 * 0x1f + 6);
  auVar191 = vpmovsxwd_avx(auVar21);
  auVar303._0_4_ = fVar201 * auVar23._0_4_ + auVar161._0_4_;
  auVar303._4_4_ = fVar203 * auVar23._4_4_ + auVar161._4_4_;
  auVar303._8_4_ = fVar228 * auVar23._8_4_ + auVar161._8_4_;
  auVar303._12_4_ = fVar230 * auVar23._12_4_ + auVar161._12_4_;
  auVar161 = vcvtdq2ps_avx(auVar191);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar72 * 0x23 + 6);
  auVar191 = vpmovsxwd_avx(auVar22);
  auVar191 = vcvtdq2ps_avx(auVar191);
  auVar191 = vsubps_avx(auVar191,auVar161);
  auVar313._0_4_ = fVar201 * auVar191._0_4_ + auVar161._0_4_;
  auVar313._4_4_ = fVar203 * auVar191._4_4_ + auVar161._4_4_;
  auVar313._8_4_ = fVar228 * auVar191._8_4_ + auVar161._8_4_;
  auVar313._12_4_ = fVar230 * auVar191._12_4_ + auVar161._12_4_;
  auVar161 = vsubps_avx(auVar133,auVar151);
  auVar262._0_4_ = fVar184 * auVar161._0_4_;
  auVar262._4_4_ = fVar198 * auVar161._4_4_;
  auVar262._8_4_ = fVar199 * auVar161._8_4_;
  auVar262._12_4_ = fVar200 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar263,auVar151);
  auVar152._0_4_ = fVar184 * auVar161._0_4_;
  auVar152._4_4_ = fVar198 * auVar161._4_4_;
  auVar152._8_4_ = fVar199 * auVar161._8_4_;
  auVar152._12_4_ = fVar200 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar342,auVar120);
  auVar185._0_4_ = fVar202 * auVar161._0_4_;
  auVar185._4_4_ = fVar227 * auVar161._4_4_;
  auVar185._8_4_ = fVar229 * auVar161._8_4_;
  auVar185._12_4_ = fVar231 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar289,auVar120);
  auVar121._0_4_ = fVar202 * auVar161._0_4_;
  auVar121._4_4_ = fVar227 * auVar161._4_4_;
  auVar121._8_4_ = fVar229 * auVar161._8_4_;
  auVar121._12_4_ = fVar231 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar303,auVar79);
  auVar181._0_4_ = fVar233 * auVar161._0_4_;
  auVar181._4_4_ = fVar250 * auVar161._4_4_;
  auVar181._8_4_ = fVar251 * auVar161._8_4_;
  auVar181._12_4_ = fVar252 * auVar161._12_4_;
  auVar161 = vsubps_avx(auVar313,auVar79);
  auVar80._0_4_ = fVar233 * auVar161._0_4_;
  auVar80._4_4_ = fVar250 * auVar161._4_4_;
  auVar80._8_4_ = fVar251 * auVar161._8_4_;
  auVar80._12_4_ = fVar252 * auVar161._12_4_;
  auVar161 = vpminsd_avx(auVar262,auVar152);
  auVar191 = vpminsd_avx(auVar185,auVar121);
  auVar161 = vmaxps_avx(auVar161,auVar191);
  auVar191 = vpminsd_avx(auVar181,auVar80);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar290._4_4_ = uVar8;
  auVar290._0_4_ = uVar8;
  auVar290._8_4_ = uVar8;
  auVar290._12_4_ = uVar8;
  auVar191 = vmaxps_avx(auVar191,auVar290);
  auVar161 = vmaxps_avx(auVar161,auVar191);
  auVar234._0_4_ = auVar161._0_4_ * 0.99999964;
  auVar234._4_4_ = auVar161._4_4_ * 0.99999964;
  auVar234._8_4_ = auVar161._8_4_ * 0.99999964;
  auVar234._12_4_ = auVar161._12_4_ * 0.99999964;
  auVar161 = vpmaxsd_avx(auVar262,auVar152);
  auVar191 = vpmaxsd_avx(auVar185,auVar121);
  auVar161 = vminps_avx(auVar161,auVar191);
  auVar191 = vpmaxsd_avx(auVar181,auVar80);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar153._4_4_ = uVar8;
  auVar153._0_4_ = uVar8;
  auVar153._8_4_ = uVar8;
  auVar153._12_4_ = uVar8;
  auVar191 = vminps_avx(auVar191,auVar153);
  auVar161 = vminps_avx(auVar161,auVar191);
  auVar81._0_4_ = auVar161._0_4_ * 1.0000004;
  auVar81._4_4_ = auVar161._4_4_ * 1.0000004;
  auVar81._8_4_ = auVar161._8_4_ * 1.0000004;
  auVar81._12_4_ = auVar161._12_4_ * 1.0000004;
  auVar161 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar191 = vpcmpgtd_avx(auVar161,_DAT_01f4ad30);
  auVar161 = vcmpps_avx(auVar234,auVar81,2);
  auVar161 = vandps_avx(auVar161,auVar191);
  uVar77 = vmovmskps_avx(auVar161);
  auVar111._16_16_ = mm_lookupmask_ps._240_16_;
  auVar111._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar111,ZEXT832(0) << 0x20,0x80);
  local_458 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar64 = ZEXT412(0);
  local_450 = prim;
LAB_008b7b1a:
  auVar66._12_4_ = 0;
  auVar66._0_12_ = auVar64;
  if (uVar77 == 0) {
    return;
  }
  lVar74 = 0;
  if (uVar77 != 0) {
    for (; (uVar77 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
    }
  }
  uVar71 = *(uint *)(local_450 + 2);
  uVar11 = *(uint *)(local_450 + lVar74 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar71].ptr;
  fVar184 = (pGVar12->time_range).lower;
  fVar184 = pGVar12->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar184) / ((pGVar12->time_range).upper - fVar184));
  auVar161 = vroundss_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),9);
  auVar161 = vminss_avx(auVar161,ZEXT416((uint)(pGVar12->fnumTimeSegments + -1.0)));
  auVar161 = vmaxss_avx(auVar66 << 0x20,auVar161);
  uVar72 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)uVar11 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar76 = (long)(int)auVar161._0_4_ * 0x38;
  lVar14 = *(long *)(_Var13 + lVar76);
  lVar15 = *(long *)(_Var13 + 0x10 + lVar76);
  pfVar3 = (float *)(lVar14 + lVar15 * uVar72);
  fVar198 = *pfVar3;
  fVar199 = pfVar3[1];
  fVar200 = pfVar3[2];
  fVar202 = pfVar3[3];
  lVar74 = uVar72 + 1;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar74);
  lVar1 = uVar72 + 2;
  pfVar4 = (float *)(lVar14 + lVar15 * lVar1);
  lVar2 = uVar72 + 3;
  pfVar5 = (float *)(lVar14 + lVar15 * lVar2);
  fVar227 = *pfVar5;
  fVar229 = pfVar5[1];
  fVar231 = pfVar5[2];
  fVar233 = pfVar5[3];
  lVar14 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar15 = *(long *)(lVar14 + lVar76);
  lVar16 = *(long *)(lVar14 + 0x10 + lVar76);
  pfVar5 = (float *)(lVar15 + lVar16 * uVar72);
  fVar250 = *pfVar5;
  fVar251 = pfVar5[1];
  fVar252 = pfVar5[2];
  fVar201 = pfVar5[3];
  pfVar5 = (float *)(lVar15 + lVar16 * lVar74);
  pfVar6 = (float *)(lVar15 + lVar16 * lVar1);
  fVar184 = fVar184 - auVar161._0_4_;
  pfVar7 = (float *)(lVar15 + lVar16 * lVar2);
  fVar203 = *pfVar7;
  fVar228 = pfVar7[1];
  fVar230 = pfVar7[2];
  fVar232 = pfVar7[3];
  fVar287 = *pfVar4 * 0.0;
  fVar298 = pfVar4[1] * 0.0;
  fVar299 = pfVar4[2] * 0.0;
  fVar300 = pfVar4[3] * 0.0;
  fVar78 = fVar287 + fVar227 * 0.0;
  fVar117 = fVar298 + fVar229 * 0.0;
  fVar118 = fVar299 + fVar231 * 0.0;
  fVar119 = fVar300 + fVar233 * 0.0;
  fVar311 = *pfVar3 * 0.0;
  fVar321 = pfVar3[1] * 0.0;
  fVar323 = pfVar3[2] * 0.0;
  fVar325 = pfVar3[3] * 0.0;
  local_5e8._0_4_ = fVar198 + fVar311 + fVar78;
  local_5e8._4_4_ = fVar199 + fVar321 + fVar117;
  fStack_5e0 = fVar200 + fVar323 + fVar118;
  fStack_5dc = fVar202 + fVar325 + fVar119;
  auVar82._0_4_ = *pfVar3 * 3.0 + fVar78;
  auVar82._4_4_ = pfVar3[1] * 3.0 + fVar117;
  auVar82._8_4_ = pfVar3[2] * 3.0 + fVar118;
  auVar82._12_4_ = pfVar3[3] * 3.0 + fVar119;
  auVar154._0_4_ = fVar198 * 3.0;
  auVar154._4_4_ = fVar199 * 3.0;
  auVar154._8_4_ = fVar200 * 3.0;
  auVar154._12_4_ = fVar202 * 3.0;
  auVar288 = vsubps_avx(auVar82,auVar154);
  fVar327 = *pfVar6 * 0.0;
  fVar333 = pfVar6[1] * 0.0;
  fVar334 = pfVar6[2] * 0.0;
  fVar335 = pfVar6[3] * 0.0;
  fVar78 = fVar327 + fVar203 * 0.0;
  fVar117 = fVar333 + fVar228 * 0.0;
  fVar118 = fVar334 + fVar230 * 0.0;
  fVar119 = fVar335 + fVar232 * 0.0;
  fVar340 = *pfVar5 * 0.0;
  fVar346 = pfVar5[1] * 0.0;
  fVar347 = pfVar5[2] * 0.0;
  fVar348 = pfVar5[3] * 0.0;
  auVar352._0_4_ = fVar340 + fVar78 + fVar250;
  auVar352._4_4_ = fVar346 + fVar117 + fVar251;
  auVar352._8_4_ = fVar347 + fVar118 + fVar252;
  auVar352._12_4_ = fVar348 + fVar119 + fVar201;
  auVar83._0_4_ = *pfVar5 * 3.0 + fVar78;
  auVar83._4_4_ = pfVar5[1] * 3.0 + fVar117;
  auVar83._8_4_ = pfVar5[2] * 3.0 + fVar118;
  auVar83._12_4_ = pfVar5[3] * 3.0 + fVar119;
  auVar253._0_4_ = fVar250 * 3.0;
  auVar253._4_4_ = fVar251 * 3.0;
  auVar253._8_4_ = fVar252 * 3.0;
  auVar253._12_4_ = fVar201 * 3.0;
  auVar24 = vsubps_avx(auVar83,auVar253);
  auVar186._0_4_ = fVar198 * 0.0;
  auVar186._4_4_ = fVar199 * 0.0;
  auVar186._8_4_ = fVar200 * 0.0;
  auVar186._12_4_ = fVar202 * 0.0;
  auVar254._0_4_ = auVar186._0_4_ + fVar311 + fVar287 + fVar227;
  auVar254._4_4_ = auVar186._4_4_ + fVar321 + fVar298 + fVar229;
  auVar254._8_4_ = auVar186._8_4_ + fVar323 + fVar299 + fVar231;
  auVar254._12_4_ = auVar186._12_4_ + fVar325 + fVar300 + fVar233;
  auVar264._0_4_ = fVar227 * 3.0;
  auVar264._4_4_ = fVar229 * 3.0;
  auVar264._8_4_ = fVar231 * 3.0;
  auVar264._12_4_ = fVar233 * 3.0;
  auVar205._0_4_ = *pfVar4 * 3.0;
  auVar205._4_4_ = pfVar4[1] * 3.0;
  auVar205._8_4_ = pfVar4[2] * 3.0;
  auVar205._12_4_ = pfVar4[3] * 3.0;
  auVar161 = vsubps_avx(auVar264,auVar205);
  auVar206._0_4_ = fVar311 + auVar161._0_4_;
  auVar206._4_4_ = fVar321 + auVar161._4_4_;
  auVar206._8_4_ = fVar323 + auVar161._8_4_;
  auVar206._12_4_ = fVar325 + auVar161._12_4_;
  auVar26 = vsubps_avx(auVar206,auVar186);
  auVar207._0_4_ = fVar250 * 0.0;
  auVar207._4_4_ = fVar251 * 0.0;
  auVar207._8_4_ = fVar252 * 0.0;
  auVar207._12_4_ = fVar201 * 0.0;
  auVar187._0_4_ = auVar207._0_4_ + fVar340 + fVar327 + fVar203;
  auVar187._4_4_ = auVar207._4_4_ + fVar346 + fVar333 + fVar228;
  auVar187._8_4_ = auVar207._8_4_ + fVar347 + fVar334 + fVar230;
  auVar187._12_4_ = auVar207._12_4_ + fVar348 + fVar335 + fVar232;
  auVar235._0_4_ = fVar203 * 3.0;
  auVar235._4_4_ = fVar228 * 3.0;
  auVar235._8_4_ = fVar230 * 3.0;
  auVar235._12_4_ = fVar232 * 3.0;
  auVar265._0_4_ = *pfVar6 * 3.0;
  auVar265._4_4_ = pfVar6[1] * 3.0;
  auVar265._8_4_ = pfVar6[2] * 3.0;
  auVar265._12_4_ = pfVar6[3] * 3.0;
  auVar161 = vsubps_avx(auVar235,auVar265);
  auVar236._0_4_ = fVar340 + auVar161._0_4_;
  auVar236._4_4_ = fVar346 + auVar161._4_4_;
  auVar236._8_4_ = fVar347 + auVar161._8_4_;
  auVar236._12_4_ = fVar348 + auVar161._12_4_;
  auVar19 = vsubps_avx(auVar236,auVar207);
  auVar161 = vshufps_avx(auVar288,auVar288,0xc9);
  auVar191 = vshufps_avx(auVar352,auVar352,0xc9);
  fVar78 = auVar288._0_4_;
  auVar237._0_4_ = fVar78 * auVar191._0_4_;
  fVar117 = auVar288._4_4_;
  auVar237._4_4_ = fVar117 * auVar191._4_4_;
  fVar118 = auVar288._8_4_;
  auVar237._8_4_ = fVar118 * auVar191._8_4_;
  fVar119 = auVar288._12_4_;
  auVar237._12_4_ = fVar119 * auVar191._12_4_;
  auVar273._0_4_ = auVar352._0_4_ * auVar161._0_4_;
  auVar273._4_4_ = auVar352._4_4_ * auVar161._4_4_;
  auVar273._8_4_ = auVar352._8_4_ * auVar161._8_4_;
  auVar273._12_4_ = auVar352._12_4_ * auVar161._12_4_;
  auVar191 = vsubps_avx(auVar273,auVar237);
  auVar23 = vshufps_avx(auVar191,auVar191,0xc9);
  auVar191 = vshufps_avx(auVar24,auVar24,0xc9);
  auVar274._0_4_ = auVar191._0_4_ * fVar78;
  auVar274._4_4_ = auVar191._4_4_ * fVar117;
  auVar274._8_4_ = auVar191._8_4_ * fVar118;
  auVar274._12_4_ = auVar191._12_4_ * fVar119;
  auVar84._0_4_ = auVar161._0_4_ * auVar24._0_4_;
  auVar84._4_4_ = auVar161._4_4_ * auVar24._4_4_;
  auVar84._8_4_ = auVar161._8_4_ * auVar24._8_4_;
  auVar84._12_4_ = auVar161._12_4_ * auVar24._12_4_;
  auVar161 = vsubps_avx(auVar84,auVar274);
  auVar24 = vshufps_avx(auVar161,auVar161,0xc9);
  auVar161 = vshufps_avx(auVar26,auVar26,0xc9);
  auVar191 = vshufps_avx(auVar187,auVar187,0xc9);
  fVar340 = auVar26._0_4_;
  auVar275._0_4_ = fVar340 * auVar191._0_4_;
  fVar346 = auVar26._4_4_;
  auVar275._4_4_ = fVar346 * auVar191._4_4_;
  fVar347 = auVar26._8_4_;
  auVar275._8_4_ = fVar347 * auVar191._8_4_;
  fVar348 = auVar26._12_4_;
  auVar275._12_4_ = fVar348 * auVar191._12_4_;
  auVar188._0_4_ = auVar161._0_4_ * auVar187._0_4_;
  auVar188._4_4_ = auVar161._4_4_ * auVar187._4_4_;
  auVar188._8_4_ = auVar161._8_4_ * auVar187._8_4_;
  auVar188._12_4_ = auVar161._12_4_ * auVar187._12_4_;
  auVar191 = vsubps_avx(auVar188,auVar275);
  auVar160 = vshufps_avx(auVar191,auVar191,0xc9);
  auVar191 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar276._0_4_ = fVar340 * auVar191._0_4_;
  auVar276._4_4_ = fVar346 * auVar191._4_4_;
  auVar276._8_4_ = fVar347 * auVar191._8_4_;
  auVar276._12_4_ = fVar348 * auVar191._12_4_;
  auVar208._0_4_ = auVar161._0_4_ * auVar19._0_4_;
  auVar208._4_4_ = auVar161._4_4_ * auVar19._4_4_;
  auVar208._8_4_ = auVar161._8_4_ * auVar19._8_4_;
  auVar208._12_4_ = auVar161._12_4_ * auVar19._12_4_;
  auVar161 = vdpps_avx(auVar23,auVar23,0x7f);
  auVar191 = vsubps_avx(auVar208,auVar276);
  auVar19 = vshufps_avx(auVar191,auVar191,0xc9);
  fVar199 = auVar161._0_4_;
  auVar277._4_12_ = ZEXT812(0) << 0x20;
  auVar277._0_4_ = fVar199;
  auVar191 = vrsqrtss_avx(auVar277,auVar277);
  fVar198 = auVar191._0_4_;
  auVar191 = ZEXT416((uint)(fVar198 * 1.5 - fVar199 * 0.5 * fVar198 * fVar198 * fVar198));
  auVar25 = vshufps_avx(auVar191,auVar191,0);
  fVar203 = auVar25._0_4_ * auVar23._0_4_;
  fVar228 = auVar25._4_4_ * auVar23._4_4_;
  fVar230 = auVar25._8_4_ * auVar23._8_4_;
  fVar232 = auVar25._12_4_ * auVar23._12_4_;
  auVar191 = vdpps_avx(auVar23,auVar24,0x7f);
  auVar161 = vshufps_avx(auVar161,auVar161,0);
  auVar85._0_4_ = auVar161._0_4_ * auVar24._0_4_;
  auVar85._4_4_ = auVar161._4_4_ * auVar24._4_4_;
  auVar85._8_4_ = auVar161._8_4_ * auVar24._8_4_;
  auVar85._12_4_ = auVar161._12_4_ * auVar24._12_4_;
  auVar161 = vshufps_avx(auVar191,auVar191,0);
  auVar238._0_4_ = auVar161._0_4_ * auVar23._0_4_;
  auVar238._4_4_ = auVar161._4_4_ * auVar23._4_4_;
  auVar238._8_4_ = auVar161._8_4_ * auVar23._8_4_;
  auVar238._12_4_ = auVar161._12_4_ * auVar23._12_4_;
  auVar20 = vsubps_avx(auVar85,auVar238);
  auVar161 = vrcpss_avx(auVar277,auVar277);
  auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar199 * auVar161._0_4_)));
  auVar23 = vshufps_avx(auVar161,auVar161,0);
  auVar161 = vdpps_avx(auVar160,auVar160,0x7f);
  fVar287 = auVar161._0_4_;
  auVar278._4_12_ = ZEXT812(0) << 0x20;
  auVar278._0_4_ = fVar287;
  auVar191 = vrsqrtss_avx(auVar278,auVar278);
  fVar250 = auVar191._0_4_;
  auVar191 = vdpps_avx(auVar160,auVar19,0x7f);
  auVar161 = vshufps_avx(auVar161,auVar161,0);
  auVar362._0_4_ = auVar19._0_4_ * auVar161._0_4_;
  auVar362._4_4_ = auVar19._4_4_ * auVar161._4_4_;
  auVar362._8_4_ = auVar19._8_4_ * auVar161._8_4_;
  auVar362._12_4_ = auVar19._12_4_ * auVar161._12_4_;
  lVar15 = *(long *)(_Var13 + 0x38 + lVar76);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar76);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar72);
  fVar198 = *pfVar3;
  fVar199 = pfVar3[1];
  fVar200 = pfVar3[2];
  fVar202 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar74);
  pfVar4 = (float *)(lVar15 + lVar16 * lVar1);
  auVar161 = vshufps_avx(auVar191,auVar191,0);
  auVar86._0_4_ = auVar160._0_4_ * auVar161._0_4_;
  auVar86._4_4_ = auVar160._4_4_ * auVar161._4_4_;
  auVar86._8_4_ = auVar160._8_4_ * auVar161._8_4_;
  auVar86._12_4_ = auVar160._12_4_ * auVar161._12_4_;
  auVar19 = vsubps_avx(auVar362,auVar86);
  pfVar5 = (float *)(lVar15 + lVar16 * lVar2);
  fVar227 = *pfVar5;
  fVar229 = pfVar5[1];
  fVar231 = pfVar5[2];
  fVar233 = pfVar5[3];
  auVar161 = ZEXT416((uint)(fVar250 * 1.5 - fVar287 * 0.5 * fVar250 * fVar250 * fVar250));
  auVar191 = vshufps_avx(auVar161,auVar161,0);
  fVar250 = auVar191._0_4_ * auVar160._0_4_;
  fVar251 = auVar191._4_4_ * auVar160._4_4_;
  fVar252 = auVar191._8_4_ * auVar160._8_4_;
  fVar201 = auVar191._12_4_ * auVar160._12_4_;
  auVar161 = vrcpss_avx(auVar278,auVar278);
  auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - auVar161._0_4_ * fVar287)));
  auVar161 = vshufps_avx(auVar161,auVar161,0);
  auVar24 = vshufps_avx(_local_5e8,_local_5e8,0xff);
  auVar353._0_4_ = auVar24._0_4_ * fVar203;
  auVar353._4_4_ = auVar24._4_4_ * fVar228;
  auVar353._8_4_ = auVar24._8_4_ * fVar230;
  auVar353._12_4_ = auVar24._12_4_ * fVar232;
  auVar160 = vshufps_avx(auVar288,auVar288,0xff);
  auVar21 = vsubps_avx(_local_5e8,auVar353);
  auVar266._0_4_ =
       auVar160._0_4_ * fVar203 + auVar24._0_4_ * auVar25._0_4_ * auVar20._0_4_ * auVar23._0_4_;
  auVar266._4_4_ =
       auVar160._4_4_ * fVar228 + auVar24._4_4_ * auVar25._4_4_ * auVar20._4_4_ * auVar23._4_4_;
  auVar266._8_4_ =
       auVar160._8_4_ * fVar230 + auVar24._8_4_ * auVar25._8_4_ * auVar20._8_4_ * auVar23._8_4_;
  auVar266._12_4_ =
       auVar160._12_4_ * fVar232 + auVar24._12_4_ * auVar25._12_4_ * auVar20._12_4_ * auVar23._12_4_
  ;
  auVar25 = vsubps_avx(auVar288,auVar266);
  local_5e8._0_4_ = (float)local_5e8._0_4_ + auVar353._0_4_;
  local_5e8._4_4_ = (float)local_5e8._4_4_ + auVar353._4_4_;
  fStack_5e0 = fStack_5e0 + auVar353._8_4_;
  fStack_5dc = fStack_5dc + auVar353._12_4_;
  auVar23 = vshufps_avx(auVar254,auVar254,0xff);
  auVar155._0_4_ = auVar23._0_4_ * fVar250;
  auVar155._4_4_ = auVar23._4_4_ * fVar251;
  auVar155._8_4_ = auVar23._8_4_ * fVar252;
  auVar155._12_4_ = auVar23._12_4_ * fVar201;
  auVar24 = vshufps_avx(auVar26,auVar26,0xff);
  auVar288 = vsubps_avx(auVar254,auVar155);
  auVar87._0_4_ =
       auVar24._0_4_ * fVar250 + auVar23._0_4_ * auVar191._0_4_ * auVar19._0_4_ * auVar161._0_4_;
  auVar87._4_4_ =
       auVar24._4_4_ * fVar251 + auVar23._4_4_ * auVar191._4_4_ * auVar19._4_4_ * auVar161._4_4_;
  auVar87._8_4_ =
       auVar24._8_4_ * fVar252 + auVar23._8_4_ * auVar191._8_4_ * auVar19._8_4_ * auVar161._8_4_;
  auVar87._12_4_ =
       auVar24._12_4_ * fVar201 +
       auVar23._12_4_ * auVar191._12_4_ * auVar19._12_4_ * auVar161._12_4_;
  auVar26 = vsubps_avx(auVar26,auVar87);
  p00.field_0.v[1] = auVar254._4_4_ + auVar155._4_4_;
  p00.field_0.v[0] = auVar254._0_4_ + auVar155._0_4_;
  p00.field_0.v[2] = auVar254._8_4_ + auVar155._8_4_;
  p00.field_0.v[3] = auVar254._12_4_ + auVar155._12_4_;
  fVar311 = *pfVar4 * 0.0;
  fVar321 = pfVar4[1] * 0.0;
  fVar323 = pfVar4[2] * 0.0;
  fVar325 = pfVar4[3] * 0.0;
  fVar360 = fVar311 + fVar227 * 0.0;
  fVar366 = fVar321 + fVar229 * 0.0;
  fVar367 = fVar323 + fVar231 * 0.0;
  fVar369 = fVar325 + fVar233 * 0.0;
  auVar88._0_4_ = fVar360 + *pfVar3 * 3.0;
  auVar88._4_4_ = fVar366 + pfVar3[1] * 3.0;
  auVar88._8_4_ = fVar367 + pfVar3[2] * 3.0;
  auVar88._12_4_ = fVar369 + pfVar3[3] * 3.0;
  auVar156._0_4_ = fVar198 * 3.0;
  auVar156._4_4_ = fVar199 * 3.0;
  auVar156._8_4_ = fVar200 * 3.0;
  auVar156._12_4_ = fVar202 * 3.0;
  auVar20 = vsubps_avx(auVar88,auVar156);
  lVar15 = *(long *)(lVar14 + 0x38 + lVar76);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar76);
  auVar161 = *(undefined1 (*) [16])(lVar15 + lVar1 * lVar14);
  pfVar5 = (float *)(lVar15 + lVar14 * lVar2);
  fVar250 = *pfVar5;
  fVar251 = pfVar5[1];
  fVar252 = pfVar5[2];
  fVar201 = pfVar5[3];
  fVar287 = auVar161._0_4_ * 0.0;
  fVar298 = auVar161._4_4_ * 0.0;
  fVar299 = auVar161._8_4_ * 0.0;
  fVar300 = auVar161._12_4_ * 0.0;
  fVar327 = fVar287 + fVar250 * 0.0;
  fVar333 = fVar298 + fVar251 * 0.0;
  fVar334 = fVar299 + fVar252 * 0.0;
  fVar335 = fVar300 + fVar201 * 0.0;
  pfVar5 = (float *)(lVar15 + lVar74 * lVar14);
  auVar354._0_4_ = *pfVar5 * 3.0 + fVar327;
  auVar354._4_4_ = pfVar5[1] * 3.0 + fVar333;
  auVar354._8_4_ = pfVar5[2] * 3.0 + fVar334;
  auVar354._12_4_ = pfVar5[3] * 3.0 + fVar335;
  pfVar6 = (float *)(lVar15 + uVar72 * lVar14);
  fVar203 = *pfVar6;
  fVar228 = pfVar6[1];
  fVar230 = pfVar6[2];
  fVar232 = pfVar6[3];
  auVar279._0_4_ = fVar203 * 3.0;
  auVar279._4_4_ = fVar228 * 3.0;
  auVar279._8_4_ = fVar230 * 3.0;
  auVar279._12_4_ = fVar232 * 3.0;
  auVar191 = vsubps_avx(auVar354,auVar279);
  auVar280._0_4_ = fVar227 * 3.0;
  auVar280._4_4_ = fVar229 * 3.0;
  auVar280._8_4_ = fVar231 * 3.0;
  auVar280._12_4_ = fVar233 * 3.0;
  auVar328._0_4_ = *pfVar4 * 3.0;
  auVar328._4_4_ = pfVar4[1] * 3.0;
  auVar328._8_4_ = pfVar4[2] * 3.0;
  auVar328._12_4_ = pfVar4[3] * 3.0;
  auVar23 = vsubps_avx(auVar280,auVar328);
  fVar312 = *pfVar3 * 0.0;
  fVar322 = pfVar3[1] * 0.0;
  fVar324 = pfVar3[2] * 0.0;
  fVar326 = pfVar3[3] * 0.0;
  auVar281._0_4_ = fVar312 + auVar23._0_4_;
  auVar281._4_4_ = fVar322 + auVar23._4_4_;
  auVar281._8_4_ = fVar324 + auVar23._8_4_;
  auVar281._12_4_ = fVar326 + auVar23._12_4_;
  auVar329._0_4_ = fVar198 + fVar312 + fVar360;
  auVar329._4_4_ = fVar199 + fVar322 + fVar366;
  auVar329._8_4_ = fVar200 + fVar324 + fVar367;
  auVar329._12_4_ = fVar202 + fVar326 + fVar369;
  auVar304._0_4_ = fVar198 * 0.0;
  auVar304._4_4_ = fVar199 * 0.0;
  auVar304._8_4_ = fVar200 * 0.0;
  auVar304._12_4_ = fVar202 * 0.0;
  local_588._0_4_ = auVar304._0_4_ + fVar312 + fVar227 + fVar311;
  local_588._4_4_ = auVar304._4_4_ + fVar322 + fVar229 + fVar321;
  fStack_580 = auVar304._8_4_ + fVar324 + fVar231 + fVar323;
  fStack_57c = auVar304._12_4_ + fVar326 + fVar233 + fVar325;
  auVar22 = vsubps_avx(auVar281,auVar304);
  auVar122._0_4_ = fVar250 * 3.0;
  auVar122._4_4_ = fVar251 * 3.0;
  auVar122._8_4_ = fVar252 * 3.0;
  auVar122._12_4_ = fVar201 * 3.0;
  auVar209._0_4_ = auVar161._0_4_ * 3.0;
  auVar209._4_4_ = auVar161._4_4_ * 3.0;
  auVar209._8_4_ = auVar161._8_4_ * 3.0;
  auVar209._12_4_ = auVar161._12_4_ * 3.0;
  auVar161 = vsubps_avx(auVar122,auVar209);
  fVar198 = *pfVar5 * 0.0;
  fVar199 = pfVar5[1] * 0.0;
  fVar200 = pfVar5[2] * 0.0;
  fVar202 = pfVar5[3] * 0.0;
  auVar123._0_4_ = fVar198 + auVar161._0_4_;
  auVar123._4_4_ = fVar199 + auVar161._4_4_;
  auVar123._8_4_ = fVar200 + auVar161._8_4_;
  auVar123._12_4_ = fVar202 + auVar161._12_4_;
  auVar157._0_4_ = fVar203 + fVar198 + fVar327;
  auVar157._4_4_ = fVar228 + fVar199 + fVar333;
  auVar157._8_4_ = fVar230 + fVar200 + fVar334;
  auVar157._12_4_ = fVar232 + fVar202 + fVar335;
  auVar89._0_4_ = fVar203 * 0.0;
  auVar89._4_4_ = fVar228 * 0.0;
  auVar89._8_4_ = fVar230 * 0.0;
  auVar89._12_4_ = fVar232 * 0.0;
  auVar189._0_4_ = auVar89._0_4_ + fVar198 + fVar287 + fVar250;
  auVar189._4_4_ = auVar89._4_4_ + fVar199 + fVar298 + fVar251;
  auVar189._8_4_ = auVar89._8_4_ + fVar200 + fVar299 + fVar252;
  auVar189._12_4_ = auVar89._12_4_ + fVar202 + fVar300 + fVar201;
  auVar24 = vsubps_avx(auVar123,auVar89);
  auVar161 = vshufps_avx(auVar157,auVar157,0xc9);
  fVar233 = auVar20._0_4_;
  auVar124._0_4_ = fVar233 * auVar161._0_4_;
  fVar250 = auVar20._4_4_;
  auVar124._4_4_ = fVar250 * auVar161._4_4_;
  fVar251 = auVar20._8_4_;
  auVar124._8_4_ = fVar251 * auVar161._8_4_;
  fVar252 = auVar20._12_4_;
  auVar124._12_4_ = fVar252 * auVar161._12_4_;
  auVar161 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar158._0_4_ = auVar161._0_4_ * auVar157._0_4_;
  auVar158._4_4_ = auVar161._4_4_ * auVar157._4_4_;
  auVar158._8_4_ = auVar161._8_4_ * auVar157._8_4_;
  auVar158._12_4_ = auVar161._12_4_ * auVar157._12_4_;
  auVar23 = vsubps_avx(auVar158,auVar124);
  auVar159._0_4_ = auVar191._0_4_ * auVar161._0_4_;
  auVar159._4_4_ = auVar191._4_4_ * auVar161._4_4_;
  auVar159._8_4_ = auVar191._8_4_ * auVar161._8_4_;
  auVar159._12_4_ = auVar191._12_4_ * auVar161._12_4_;
  auVar161 = vshufps_avx(auVar191,auVar191,0xc9);
  auVar210._0_4_ = fVar233 * auVar161._0_4_;
  auVar210._4_4_ = fVar250 * auVar161._4_4_;
  auVar210._8_4_ = fVar251 * auVar161._8_4_;
  auVar210._12_4_ = fVar252 * auVar161._12_4_;
  auVar160 = vsubps_avx(auVar159,auVar210);
  auVar161 = vshufps_avx(auVar189,auVar189,0xc9);
  fVar201 = auVar22._0_4_;
  auVar211._0_4_ = fVar201 * auVar161._0_4_;
  fVar203 = auVar22._4_4_;
  auVar211._4_4_ = fVar203 * auVar161._4_4_;
  fVar228 = auVar22._8_4_;
  auVar211._8_4_ = fVar228 * auVar161._8_4_;
  fVar230 = auVar22._12_4_;
  auVar211._12_4_ = fVar230 * auVar161._12_4_;
  auVar161 = vshufps_avx(auVar22,auVar22,0xc9);
  auVar190._0_4_ = auVar161._0_4_ * auVar189._0_4_;
  auVar190._4_4_ = auVar161._4_4_ * auVar189._4_4_;
  auVar190._8_4_ = auVar161._8_4_ * auVar189._8_4_;
  auVar190._12_4_ = auVar161._12_4_ * auVar189._12_4_;
  auVar19 = vsubps_avx(auVar190,auVar211);
  auVar23 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar125._0_4_ = auVar161._0_4_ * auVar24._0_4_;
  auVar125._4_4_ = auVar161._4_4_ * auVar24._4_4_;
  auVar125._8_4_ = auVar161._8_4_ * auVar24._8_4_;
  auVar125._12_4_ = auVar161._12_4_ * auVar24._12_4_;
  auVar191 = vshufps_avx(auVar24,auVar24,0xc9);
  auVar161 = vdpps_avx(auVar23,auVar23,0x7f);
  auVar90._0_4_ = fVar201 * auVar191._0_4_;
  auVar90._4_4_ = fVar203 * auVar191._4_4_;
  auVar90._8_4_ = fVar228 * auVar191._8_4_;
  auVar90._12_4_ = fVar230 * auVar191._12_4_;
  auVar79 = vsubps_avx(auVar125,auVar90);
  auVar24 = vshufps_avx(auVar160,auVar160,0xc9);
  fVar198 = auVar161._0_4_;
  auVar160 = ZEXT416((uint)fVar198);
  auVar191 = vrsqrtss_avx(auVar160,auVar160);
  fVar199 = auVar191._0_4_;
  auVar191 = vdpps_avx(auVar23,auVar24,0x7f);
  auVar161 = vshufps_avx(auVar161,auVar161,0);
  auVar91._0_4_ = auVar161._0_4_ * auVar24._0_4_;
  auVar91._4_4_ = auVar161._4_4_ * auVar24._4_4_;
  auVar91._8_4_ = auVar161._8_4_ * auVar24._8_4_;
  auVar91._12_4_ = auVar161._12_4_ * auVar24._12_4_;
  auVar161 = vshufps_avx(auVar191,auVar191,0);
  auVar239._0_4_ = auVar23._0_4_ * auVar161._0_4_;
  auVar239._4_4_ = auVar23._4_4_ * auVar161._4_4_;
  auVar239._8_4_ = auVar23._8_4_ * auVar161._8_4_;
  auVar239._12_4_ = auVar23._12_4_ * auVar161._12_4_;
  auVar80 = vsubps_avx(auVar91,auVar239);
  auVar161 = vrcpss_avx(auVar160,auVar160);
  auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar198 * auVar161._0_4_)));
  auVar24 = vshufps_avx(auVar161,auVar161,0);
  auVar160 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar161 = ZEXT416((uint)(fVar199 * 1.5 - fVar198 * 0.5 * fVar199 * fVar199 * fVar199));
  auVar19 = vshufps_avx(auVar161,auVar161,0);
  auVar161 = vdpps_avx(auVar160,auVar160,0x7f);
  fVar227 = auVar23._0_4_ * auVar19._0_4_;
  fVar229 = auVar23._4_4_ * auVar19._4_4_;
  fVar231 = auVar23._8_4_ * auVar19._8_4_;
  fVar232 = auVar23._12_4_ * auVar19._12_4_;
  auVar23 = vshufps_avx(auVar79,auVar79,0xc9);
  fVar199 = auVar161._0_4_;
  auVar81 = ZEXT416((uint)fVar199);
  auVar191 = vrsqrtss_avx(auVar81,auVar81);
  fVar198 = auVar191._0_4_;
  auVar191 = vdpps_avx(auVar160,auVar23,0x7f);
  auVar161 = vshufps_avx(auVar161,auVar161,0);
  auVar126._0_4_ = auVar161._0_4_ * auVar23._0_4_;
  auVar126._4_4_ = auVar161._4_4_ * auVar23._4_4_;
  auVar126._8_4_ = auVar161._8_4_ * auVar23._8_4_;
  auVar126._12_4_ = auVar161._12_4_ * auVar23._12_4_;
  auVar161 = vshufps_avx(auVar191,auVar191,0);
  auVar240._0_4_ = auVar160._0_4_ * auVar161._0_4_;
  auVar240._4_4_ = auVar160._4_4_ * auVar161._4_4_;
  auVar240._8_4_ = auVar160._8_4_ * auVar161._8_4_;
  auVar240._12_4_ = auVar160._12_4_ * auVar161._12_4_;
  auVar79 = vsubps_avx(auVar126,auVar240);
  auVar161 = vrcpss_avx(auVar81,auVar81);
  auVar161 = ZEXT416((uint)(auVar161._0_4_ * (2.0 - fVar199 * auVar161._0_4_)));
  auVar161 = vshufps_avx(auVar161,auVar161,0);
  auVar191 = ZEXT416((uint)(fVar198 * 1.5 - fVar199 * 0.5 * fVar198 * fVar198 * fVar198));
  auVar191 = vshufps_avx(auVar191,auVar191,0);
  fVar198 = auVar160._0_4_ * auVar191._0_4_;
  fVar199 = auVar160._4_4_ * auVar191._4_4_;
  fVar200 = auVar160._8_4_ * auVar191._8_4_;
  fVar202 = auVar160._12_4_ * auVar191._12_4_;
  auVar23 = vshufps_avx(auVar20,auVar20,0xff);
  auVar160 = vshufps_avx(auVar329,auVar329,0xff);
  auVar212._0_4_ = fVar227 * auVar160._0_4_;
  auVar212._4_4_ = fVar229 * auVar160._4_4_;
  auVar212._8_4_ = fVar231 * auVar160._8_4_;
  auVar212._12_4_ = fVar232 * auVar160._12_4_;
  auVar162._0_4_ =
       fVar227 * auVar23._0_4_ + auVar19._0_4_ * auVar80._0_4_ * auVar24._0_4_ * auVar160._0_4_;
  auVar162._4_4_ =
       fVar229 * auVar23._4_4_ + auVar19._4_4_ * auVar80._4_4_ * auVar24._4_4_ * auVar160._4_4_;
  auVar162._8_4_ =
       fVar231 * auVar23._8_4_ + auVar19._8_4_ * auVar80._8_4_ * auVar24._8_4_ * auVar160._8_4_;
  auVar162._12_4_ =
       fVar232 * auVar23._12_4_ + auVar19._12_4_ * auVar80._12_4_ * auVar24._12_4_ * auVar160._12_4_
  ;
  auVar160 = vsubps_avx(auVar329,auVar212);
  auVar19 = vsubps_avx(auVar20,auVar162);
  auVar23 = vshufps_avx(auVar22,auVar22,0xff);
  auVar24 = vshufps_avx(_local_588,_local_588,0xff);
  auVar92._0_4_ = auVar24._0_4_ * fVar198;
  auVar92._4_4_ = auVar24._4_4_ * fVar199;
  auVar92._8_4_ = auVar24._8_4_ * fVar200;
  auVar92._12_4_ = auVar24._12_4_ * fVar202;
  auVar127._0_4_ =
       auVar23._0_4_ * fVar198 + auVar24._0_4_ * auVar191._0_4_ * auVar79._0_4_ * auVar161._0_4_;
  auVar127._4_4_ =
       auVar23._4_4_ * fVar199 + auVar24._4_4_ * auVar191._4_4_ * auVar79._4_4_ * auVar161._4_4_;
  auVar127._8_4_ =
       auVar23._8_4_ * fVar200 + auVar24._8_4_ * auVar191._8_4_ * auVar79._8_4_ * auVar161._8_4_;
  auVar127._12_4_ =
       auVar23._12_4_ * fVar202 +
       auVar24._12_4_ * auVar191._12_4_ * auVar79._12_4_ * auVar161._12_4_;
  auVar23 = vsubps_avx(_local_588,auVar92);
  auVar343._0_4_ = (float)local_588._0_4_ + auVar92._0_4_;
  auVar343._4_4_ = (float)local_588._4_4_ + auVar92._4_4_;
  auVar343._8_4_ = fStack_580 + auVar92._8_4_;
  auVar343._12_4_ = fStack_57c + auVar92._12_4_;
  auVar24 = vsubps_avx(auVar22,auVar127);
  local_538 = auVar25._0_4_;
  fStack_534 = auVar25._4_4_;
  fStack_530 = auVar25._8_4_;
  fStack_52c = auVar25._12_4_;
  local_488 = auVar21._0_4_;
  fStack_484 = auVar21._4_4_;
  fStack_480 = auVar21._8_4_;
  fStack_47c = auVar21._12_4_;
  auVar161 = vshufps_avx(ZEXT416((uint)fVar184),ZEXT416((uint)fVar184),0);
  auVar191 = vshufps_avx(ZEXT416((uint)(1.0 - fVar184)),ZEXT416((uint)(1.0 - fVar184)),0);
  fVar202 = auVar161._0_4_;
  fVar227 = auVar161._4_4_;
  fVar229 = auVar161._8_4_;
  fVar231 = auVar161._12_4_;
  fVar184 = auVar191._0_4_;
  fVar198 = auVar191._4_4_;
  fVar199 = auVar191._8_4_;
  fVar200 = auVar191._12_4_;
  auVar291._0_4_ = fVar184 * local_488 + fVar202 * auVar160._0_4_;
  auVar291._4_4_ = fVar198 * fStack_484 + fVar227 * auVar160._4_4_;
  auVar291._8_4_ = fVar199 * fStack_480 + fVar229 * auVar160._8_4_;
  auVar291._12_4_ = fVar200 * fStack_47c + fVar231 * auVar160._12_4_;
  fVar287 = fVar184 * (local_488 + local_538 * 0.33333334) +
            fVar202 * (auVar160._0_4_ + auVar19._0_4_ * 0.33333334);
  fVar298 = fVar198 * (fStack_484 + fStack_534 * 0.33333334) +
            fVar227 * (auVar160._4_4_ + auVar19._4_4_ * 0.33333334);
  fVar299 = fVar199 * (fStack_480 + fStack_530 * 0.33333334) +
            fVar229 * (auVar160._8_4_ + auVar19._8_4_ * 0.33333334);
  fVar300 = fVar200 * (fStack_47c + fStack_52c * 0.33333334) +
            fVar231 * (auVar160._12_4_ + auVar19._12_4_ * 0.33333334);
  local_5b8 = auVar26._0_4_;
  fStack_5b4 = auVar26._4_4_;
  fStack_5b0 = auVar26._8_4_;
  fStack_5ac = auVar26._12_4_;
  auVar192._0_4_ = local_5b8 * 0.33333334;
  auVar192._4_4_ = fStack_5b4 * 0.33333334;
  auVar192._8_4_ = fStack_5b0 * 0.33333334;
  auVar192._12_4_ = fStack_5ac * 0.33333334;
  auVar161 = vsubps_avx(auVar288,auVar192);
  auVar241._0_4_ = (fVar340 + auVar87._0_4_) * 0.33333334;
  auVar241._4_4_ = (fVar346 + auVar87._4_4_) * 0.33333334;
  auVar241._8_4_ = (fVar347 + auVar87._8_4_) * 0.33333334;
  auVar241._12_4_ = (fVar348 + auVar87._12_4_) * 0.33333334;
  auVar191 = vsubps_avx((undefined1  [16])p00.field_0,auVar241);
  auVar163._0_4_ = auVar24._0_4_ * 0.33333334;
  auVar163._4_4_ = auVar24._4_4_ * 0.33333334;
  auVar163._8_4_ = auVar24._8_4_ * 0.33333334;
  auVar163._12_4_ = auVar24._12_4_ * 0.33333334;
  auVar24 = vsubps_avx(auVar23,auVar163);
  auVar128._0_4_ = (fVar201 + auVar127._0_4_) * 0.33333334;
  auVar128._4_4_ = (fVar203 + auVar127._4_4_) * 0.33333334;
  auVar128._8_4_ = (fVar228 + auVar127._8_4_) * 0.33333334;
  auVar128._12_4_ = (fVar230 + auVar127._12_4_) * 0.33333334;
  auVar160 = vsubps_avx(auVar343,auVar128);
  auVar355._0_4_ = fVar184 * auVar161._0_4_ + fVar202 * auVar24._0_4_;
  auVar355._4_4_ = fVar198 * auVar161._4_4_ + fVar227 * auVar24._4_4_;
  auVar355._8_4_ = fVar199 * auVar161._8_4_ + fVar229 * auVar24._8_4_;
  auVar355._12_4_ = fVar200 * auVar161._12_4_ + fVar231 * auVar24._12_4_;
  auVar305._0_4_ = fVar202 * auVar23._0_4_ + auVar288._0_4_ * fVar184;
  auVar305._4_4_ = fVar227 * auVar23._4_4_ + auVar288._4_4_ * fVar198;
  auVar305._8_4_ = fVar229 * auVar23._8_4_ + auVar288._8_4_ * fVar199;
  auVar305._12_4_ = fVar231 * auVar23._12_4_ + auVar288._12_4_ * fVar200;
  auVar330._0_4_ = fVar184 * (float)local_5e8._0_4_ + fVar202 * (auVar329._0_4_ + auVar212._0_4_);
  auVar330._4_4_ = fVar198 * (float)local_5e8._4_4_ + fVar227 * (auVar329._4_4_ + auVar212._4_4_);
  auVar330._8_4_ = fVar199 * fStack_5e0 + fVar229 * (auVar329._8_4_ + auVar212._8_4_);
  auVar330._12_4_ = fVar200 * fStack_5dc + fVar231 * (auVar329._12_4_ + auVar212._12_4_);
  auVar344._0_4_ =
       fVar184 * ((float)local_5e8._0_4_ + (fVar78 + auVar266._0_4_) * 0.33333334) +
       fVar202 * (auVar329._0_4_ + auVar212._0_4_ + (fVar233 + auVar162._0_4_) * 0.33333334);
  auVar344._4_4_ =
       fVar198 * ((float)local_5e8._4_4_ + (fVar117 + auVar266._4_4_) * 0.33333334) +
       fVar227 * (auVar329._4_4_ + auVar212._4_4_ + (fVar250 + auVar162._4_4_) * 0.33333334);
  auVar344._8_4_ =
       fVar199 * (fStack_5e0 + (fVar118 + auVar266._8_4_) * 0.33333334) +
       fVar229 * (auVar329._8_4_ + auVar212._8_4_ + (fVar251 + auVar162._8_4_) * 0.33333334);
  auVar344._12_4_ =
       fVar200 * (fStack_5dc + (fVar119 + auVar266._12_4_) * 0.33333334) +
       fVar231 * (auVar329._12_4_ + auVar212._12_4_ + (fVar252 + auVar162._12_4_) * 0.33333334);
  auVar363._0_4_ = fVar184 * auVar191._0_4_ + fVar202 * auVar160._0_4_;
  auVar363._4_4_ = fVar198 * auVar191._4_4_ + fVar227 * auVar160._4_4_;
  auVar363._8_4_ = fVar199 * auVar191._8_4_ + fVar229 * auVar160._8_4_;
  auVar363._12_4_ = fVar200 * auVar191._12_4_ + fVar231 * auVar160._12_4_;
  auVar161 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar161 = vinsertps_avx(auVar161,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar201 = (auVar254._0_4_ + auVar155._0_4_) * fVar184 + fVar202 * auVar343._0_4_;
  fVar228 = (auVar254._4_4_ + auVar155._4_4_) * fVar198 + fVar227 * auVar343._4_4_;
  fVar232 = (auVar254._8_4_ + auVar155._8_4_) * fVar199 + fVar229 * auVar343._8_4_;
  fVar78 = (auVar254._12_4_ + auVar155._12_4_) * fVar200 + fVar231 * auVar343._12_4_;
  auVar288 = vsubps_avx(auVar291,auVar161);
  auVar23 = vmovsldup_avx(auVar288);
  auVar191 = vmovshdup_avx(auVar288);
  auVar24 = vshufps_avx(auVar288,auVar288,0xaa);
  fVar184 = pre->ray_space[k].vx.field_0.m128[0];
  fVar198 = pre->ray_space[k].vx.field_0.m128[1];
  fVar199 = pre->ray_space[k].vx.field_0.m128[2];
  fVar200 = pre->ray_space[k].vx.field_0.m128[3];
  fVar202 = pre->ray_space[k].vy.field_0.m128[0];
  fVar227 = pre->ray_space[k].vy.field_0.m128[1];
  fVar229 = pre->ray_space[k].vy.field_0.m128[2];
  fVar231 = pre->ray_space[k].vy.field_0.m128[3];
  fVar233 = pre->ray_space[k].vz.field_0.m128[0];
  fVar250 = pre->ray_space[k].vz.field_0.m128[1];
  fVar251 = pre->ray_space[k].vz.field_0.m128[2];
  fVar252 = pre->ray_space[k].vz.field_0.m128[3];
  local_608._0_4_ = fVar184 * auVar23._0_4_ + fVar202 * auVar191._0_4_ + fVar233 * auVar24._0_4_;
  local_608._4_4_ = fVar198 * auVar23._4_4_ + fVar227 * auVar191._4_4_ + fVar250 * auVar24._4_4_;
  fStack_600 = fVar199 * auVar23._8_4_ + fVar229 * auVar191._8_4_ + fVar251 * auVar24._8_4_;
  fStack_5fc = fVar200 * auVar23._12_4_ + fVar231 * auVar191._12_4_ + fVar252 * auVar24._12_4_;
  auVar67._4_4_ = fVar298;
  auVar67._0_4_ = fVar287;
  auVar67._8_4_ = fVar299;
  auVar67._12_4_ = fVar300;
  auVar26 = vsubps_avx(auVar67,auVar161);
  auVar24 = vshufps_avx(auVar26,auVar26,0xaa);
  auVar191 = vmovshdup_avx(auVar26);
  auVar23 = vmovsldup_avx(auVar26);
  fVar203 = fVar184 * auVar23._0_4_ + fVar202 * auVar191._0_4_ + fVar233 * auVar24._0_4_;
  fVar230 = fVar198 * auVar23._4_4_ + fVar227 * auVar191._4_4_ + fVar250 * auVar24._4_4_;
  local_5e8._4_4_ = fVar230;
  local_5e8._0_4_ = fVar203;
  fStack_5e0 = fVar199 * auVar23._8_4_ + fVar229 * auVar191._8_4_ + fVar251 * auVar24._8_4_;
  fStack_5dc = fVar200 * auVar23._12_4_ + fVar231 * auVar191._12_4_ + fVar252 * auVar24._12_4_;
  auVar20 = vsubps_avx(auVar355,auVar161);
  auVar24 = vshufps_avx(auVar20,auVar20,0xaa);
  auVar191 = vmovshdup_avx(auVar20);
  auVar23 = vmovsldup_avx(auVar20);
  auVar213._0_4_ = fVar184 * auVar23._0_4_ + fVar202 * auVar191._0_4_ + fVar233 * auVar24._0_4_;
  auVar213._4_4_ = fVar198 * auVar23._4_4_ + fVar227 * auVar191._4_4_ + fVar250 * auVar24._4_4_;
  auVar213._8_4_ = fVar199 * auVar23._8_4_ + fVar229 * auVar191._8_4_ + fVar251 * auVar24._8_4_;
  auVar213._12_4_ = fVar200 * auVar23._12_4_ + fVar231 * auVar191._12_4_ + fVar252 * auVar24._12_4_;
  auVar21 = vsubps_avx(auVar305,auVar161);
  auVar24 = vshufps_avx(auVar21,auVar21,0xaa);
  auVar191 = vmovshdup_avx(auVar21);
  auVar23 = vmovsldup_avx(auVar21);
  auVar129._0_4_ = auVar23._0_4_ * fVar184 + auVar191._0_4_ * fVar202 + fVar233 * auVar24._0_4_;
  auVar129._4_4_ = auVar23._4_4_ * fVar198 + auVar191._4_4_ * fVar227 + fVar250 * auVar24._4_4_;
  auVar129._8_4_ = auVar23._8_4_ * fVar199 + auVar191._8_4_ * fVar229 + fVar251 * auVar24._8_4_;
  auVar129._12_4_ = auVar23._12_4_ * fVar200 + auVar191._12_4_ * fVar231 + fVar252 * auVar24._12_4_;
  auVar22 = vsubps_avx(auVar330,auVar161);
  auVar24 = vshufps_avx(auVar22,auVar22,0xaa);
  auVar191 = vmovshdup_avx(auVar22);
  auVar23 = vmovsldup_avx(auVar22);
  auVar282._0_4_ = auVar23._0_4_ * fVar184 + auVar191._0_4_ * fVar202 + auVar24._0_4_ * fVar233;
  auVar282._4_4_ = auVar23._4_4_ * fVar198 + auVar191._4_4_ * fVar227 + auVar24._4_4_ * fVar250;
  auVar282._8_4_ = auVar23._8_4_ * fVar199 + auVar191._8_4_ * fVar229 + auVar24._8_4_ * fVar251;
  auVar282._12_4_ = auVar23._12_4_ * fVar200 + auVar191._12_4_ * fVar231 + auVar24._12_4_ * fVar252;
  auVar79 = vsubps_avx(auVar344,auVar161);
  auVar24 = vshufps_avx(auVar79,auVar79,0xaa);
  auVar191 = vmovshdup_avx(auVar79);
  auVar23 = vmovsldup_avx(auVar79);
  auVar292._0_4_ = auVar23._0_4_ * fVar184 + auVar191._0_4_ * fVar202 + auVar24._0_4_ * fVar233;
  auVar292._4_4_ = auVar23._4_4_ * fVar198 + auVar191._4_4_ * fVar227 + auVar24._4_4_ * fVar250;
  auVar292._8_4_ = auVar23._8_4_ * fVar199 + auVar191._8_4_ * fVar229 + auVar24._8_4_ * fVar251;
  auVar292._12_4_ = auVar23._12_4_ * fVar200 + auVar191._12_4_ * fVar231 + auVar24._12_4_ * fVar252;
  auVar80 = vsubps_avx(auVar363,auVar161);
  auVar24 = vshufps_avx(auVar80,auVar80,0xaa);
  auVar191 = vmovshdup_avx(auVar80);
  auVar23 = vmovsldup_avx(auVar80);
  auVar306._0_4_ = auVar23._0_4_ * fVar184 + auVar191._0_4_ * fVar202 + auVar24._0_4_ * fVar233;
  auVar306._4_4_ = auVar23._4_4_ * fVar198 + auVar191._4_4_ * fVar227 + auVar24._4_4_ * fVar250;
  auVar306._8_4_ = auVar23._8_4_ * fVar199 + auVar191._8_4_ * fVar229 + auVar24._8_4_ * fVar251;
  auVar306._12_4_ = auVar23._12_4_ * fVar200 + auVar191._12_4_ * fVar231 + auVar24._12_4_ * fVar252;
  auVar69._4_4_ = fVar228;
  auVar69._0_4_ = fVar201;
  auVar69._8_4_ = fVar232;
  auVar69._12_4_ = fVar78;
  auVar81 = vsubps_avx(auVar69,auVar161);
  auVar23 = vshufps_avx(auVar81,auVar81,0xaa);
  auVar161 = vmovshdup_avx(auVar81);
  auVar191 = vmovsldup_avx(auVar81);
  auVar93._0_4_ = fVar184 * auVar191._0_4_ + fVar202 * auVar161._0_4_ + fVar233 * auVar23._0_4_;
  auVar93._4_4_ = fVar198 * auVar191._4_4_ + fVar227 * auVar161._4_4_ + fVar250 * auVar23._4_4_;
  auVar93._8_4_ = fVar199 * auVar191._8_4_ + fVar229 * auVar161._8_4_ + fVar251 * auVar23._8_4_;
  auVar93._12_4_ = fVar200 * auVar191._12_4_ + fVar231 * auVar161._12_4_ + fVar252 * auVar23._12_4_;
  auVar24 = vmovlhps_avx(_local_608,auVar282);
  auVar160 = vmovlhps_avx(_local_5e8,auVar292);
  auVar19 = vmovlhps_avx(auVar213,auVar306);
  auVar25 = vmovlhps_avx(auVar129,auVar93);
  auVar161 = vminps_avx(auVar24,auVar160);
  auVar191 = vminps_avx(auVar19,auVar25);
  auVar23 = vminps_avx(auVar161,auVar191);
  auVar161 = vmaxps_avx(auVar24,auVar160);
  auVar191 = vmaxps_avx(auVar19,auVar25);
  auVar161 = vmaxps_avx(auVar161,auVar191);
  auVar191 = vshufpd_avx(auVar23,auVar23,3);
  auVar23 = vminps_avx(auVar23,auVar191);
  auVar191 = vshufpd_avx(auVar161,auVar161,3);
  auVar191 = vmaxps_avx(auVar161,auVar191);
  auVar255._8_4_ = 0x7fffffff;
  auVar255._0_8_ = 0x7fffffff7fffffff;
  auVar255._12_4_ = 0x7fffffff;
  auVar161 = vandps_avx(auVar23,auVar255);
  auVar191 = vandps_avx(auVar191,auVar255);
  auVar161 = vmaxps_avx(auVar161,auVar191);
  auVar191 = vmovshdup_avx(auVar161);
  auVar161 = vmaxss_avx(auVar191,auVar161);
  fVar198 = auVar161._0_4_ * 9.536743e-07;
  auVar161 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
  local_78._16_16_ = auVar161;
  local_78._0_16_ = auVar161;
  auVar94._0_8_ = auVar161._0_8_ ^ 0x8000000080000000;
  auVar94._8_4_ = auVar161._8_4_ ^ 0x80000000;
  auVar94._12_4_ = auVar161._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar94;
  local_98._0_16_ = auVar94;
  auVar161 = vpshufd_avx(ZEXT416(uVar71),0);
  auVar191 = vpshufd_avx(ZEXT416(uVar11),0);
  uVar72 = 0;
  fVar184 = *(float *)(ray + k * 4 + 0x30);
  auVar23 = vsubps_avx(auVar160,auVar24);
  auVar121 = vsubps_avx(auVar19,auVar160);
  auVar120 = vsubps_avx(auVar25,auVar19);
  auVar151 = vsubps_avx(auVar330,auVar291);
  auVar68._4_4_ = fVar298;
  auVar68._0_4_ = fVar287;
  auVar68._8_4_ = fVar299;
  auVar68._12_4_ = fVar300;
  auVar152 = vsubps_avx(auVar344,auVar68);
  auVar153 = vsubps_avx(auVar363,auVar355);
  auVar185 = vsubps_avx(auVar69,auVar305);
  auVar320 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar365 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_008b870c:
  do {
    auVar289 = auVar365._0_16_;
    auVar272 = auVar320._0_16_;
    auVar98 = vshufps_avx(auVar272,auVar272,0x50);
    auVar356._8_4_ = 0x3f800000;
    auVar356._0_8_ = 0x3f8000003f800000;
    auVar356._12_4_ = 0x3f800000;
    auVar359._16_4_ = 0x3f800000;
    auVar359._0_16_ = auVar356;
    auVar359._20_4_ = 0x3f800000;
    auVar359._24_4_ = 0x3f800000;
    auVar359._28_4_ = 0x3f800000;
    auVar204 = vsubps_avx(auVar356,auVar98);
    fVar199 = auVar98._0_4_;
    fVar200 = auVar98._4_4_;
    fVar202 = auVar98._8_4_;
    fVar227 = auVar98._12_4_;
    fVar229 = auVar204._0_4_;
    fVar231 = auVar204._4_4_;
    fVar233 = auVar204._8_4_;
    fVar250 = auVar204._12_4_;
    auVar193._0_4_ = auVar282._0_4_ * fVar199 + fVar229 * (float)local_608._0_4_;
    auVar193._4_4_ = auVar282._4_4_ * fVar200 + fVar231 * (float)local_608._4_4_;
    auVar193._8_4_ = auVar282._0_4_ * fVar202 + fVar233 * (float)local_608._0_4_;
    auVar193._12_4_ = auVar282._4_4_ * fVar227 + fVar250 * (float)local_608._4_4_;
    auVar164._0_4_ = auVar292._0_4_ * fVar199 + fVar203 * fVar229;
    auVar164._4_4_ = auVar292._4_4_ * fVar200 + fVar230 * fVar231;
    auVar164._8_4_ = auVar292._0_4_ * fVar202 + fVar203 * fVar233;
    auVar164._12_4_ = auVar292._4_4_ * fVar227 + fVar230 * fVar250;
    auVar267._0_4_ = auVar306._0_4_ * fVar199 + auVar213._0_4_ * fVar229;
    auVar267._4_4_ = auVar306._4_4_ * fVar200 + auVar213._4_4_ * fVar231;
    auVar267._8_4_ = auVar306._0_4_ * fVar202 + auVar213._0_4_ * fVar233;
    auVar267._12_4_ = auVar306._4_4_ * fVar227 + auVar213._4_4_ * fVar250;
    auVar214._0_4_ = auVar93._0_4_ * fVar199 + auVar129._0_4_ * fVar229;
    auVar214._4_4_ = auVar93._4_4_ * fVar200 + auVar129._4_4_ * fVar231;
    auVar214._8_4_ = auVar93._0_4_ * fVar202 + auVar129._0_4_ * fVar233;
    auVar214._12_4_ = auVar93._4_4_ * fVar227 + auVar129._4_4_ * fVar250;
    auVar98 = vmovshdup_avx(auVar289);
    auVar204 = vshufps_avx(auVar289,auVar289,0);
    auVar296._16_16_ = auVar204;
    auVar296._0_16_ = auVar204;
    auVar181 = vshufps_avx(auVar289,auVar289,0x55);
    auVar112._16_16_ = auVar181;
    auVar112._0_16_ = auVar181;
    auVar111 = vsubps_avx(auVar112,auVar296);
    auVar181 = vshufps_avx(auVar193,auVar193,0);
    auVar144 = vshufps_avx(auVar193,auVar193,0x55);
    auVar132 = vshufps_avx(auVar164,auVar164,0);
    auVar167 = vshufps_avx(auVar164,auVar164,0x55);
    auVar133 = vshufps_avx(auVar267,auVar267,0);
    auVar262 = vshufps_avx(auVar267,auVar267,0x55);
    auVar263 = vshufps_avx(auVar214,auVar214,0);
    auVar271 = vshufps_avx(auVar214,auVar214,0x55);
    auVar98 = ZEXT416((uint)((auVar98._0_4_ - auVar365._0_4_) * 0.04761905));
    auVar98 = vshufps_avx(auVar98,auVar98,0);
    auVar310._0_4_ = auVar204._0_4_ + auVar111._0_4_ * 0.0;
    auVar310._4_4_ = auVar204._4_4_ + auVar111._4_4_ * 0.14285715;
    auVar310._8_4_ = auVar204._8_4_ + auVar111._8_4_ * 0.2857143;
    auVar310._12_4_ = auVar204._12_4_ + auVar111._12_4_ * 0.42857146;
    auVar310._16_4_ = auVar204._0_4_ + auVar111._16_4_ * 0.5714286;
    auVar310._20_4_ = auVar204._4_4_ + auVar111._20_4_ * 0.71428573;
    auVar310._24_4_ = auVar204._8_4_ + auVar111._24_4_ * 0.8571429;
    auVar310._28_4_ = auVar204._12_4_ + auVar111._28_4_;
    auVar27 = vsubps_avx(auVar359,auVar310);
    fVar199 = auVar132._0_4_;
    fVar202 = auVar132._4_4_;
    fVar229 = auVar132._8_4_;
    fVar233 = auVar132._12_4_;
    fVar326 = auVar27._0_4_;
    fVar360 = auVar27._4_4_;
    fVar366 = auVar27._8_4_;
    fVar367 = auVar27._12_4_;
    fVar369 = auVar27._16_4_;
    fVar301 = auVar27._20_4_;
    fVar302 = auVar27._24_4_;
    fVar335 = auVar167._0_4_;
    fVar346 = auVar167._4_4_;
    fVar348 = auVar167._8_4_;
    fVar322 = auVar167._12_4_;
    fVar349 = auVar144._12_4_ + 1.0;
    fVar325 = auVar133._0_4_;
    fVar327 = auVar133._4_4_;
    fVar333 = auVar133._8_4_;
    fVar334 = auVar133._12_4_;
    fVar251 = fVar325 * auVar310._0_4_ + fVar326 * fVar199;
    fVar252 = fVar327 * auVar310._4_4_ + fVar360 * fVar202;
    fVar117 = fVar333 * auVar310._8_4_ + fVar366 * fVar229;
    fVar118 = fVar334 * auVar310._12_4_ + fVar367 * fVar233;
    fVar119 = fVar325 * auVar310._16_4_ + fVar369 * fVar199;
    fVar311 = fVar327 * auVar310._20_4_ + fVar301 * fVar202;
    fVar321 = fVar333 * auVar310._24_4_ + fVar302 * fVar229;
    fVar200 = auVar262._0_4_;
    fVar227 = auVar262._4_4_;
    fVar231 = auVar262._8_4_;
    fVar250 = auVar262._12_4_;
    fVar340 = fVar335 * fVar326 + auVar310._0_4_ * fVar200;
    fVar347 = fVar346 * fVar360 + auVar310._4_4_ * fVar227;
    fVar312 = fVar348 * fVar366 + auVar310._8_4_ * fVar231;
    fVar324 = fVar322 * fVar367 + auVar310._12_4_ * fVar250;
    fVar336 = fVar335 * fVar369 + auVar310._16_4_ * fVar200;
    fVar337 = fVar346 * fVar301 + auVar310._20_4_ * fVar227;
    fVar338 = fVar348 * fVar302 + auVar310._24_4_ * fVar231;
    fVar339 = fVar322 + fVar233;
    auVar204 = vshufps_avx(auVar193,auVar193,0xaa);
    auVar132 = vshufps_avx(auVar193,auVar193,0xff);
    fVar323 = fVar334 + 0.0;
    auVar167 = vshufps_avx(auVar164,auVar164,0xaa);
    auVar133 = vshufps_avx(auVar164,auVar164,0xff);
    auVar225._0_4_ =
         fVar326 * (auVar310._0_4_ * fVar199 + fVar326 * auVar181._0_4_) + auVar310._0_4_ * fVar251;
    auVar225._4_4_ =
         fVar360 * (auVar310._4_4_ * fVar202 + fVar360 * auVar181._4_4_) + auVar310._4_4_ * fVar252;
    auVar225._8_4_ =
         fVar366 * (auVar310._8_4_ * fVar229 + fVar366 * auVar181._8_4_) + auVar310._8_4_ * fVar117;
    auVar225._12_4_ =
         fVar367 * (auVar310._12_4_ * fVar233 + fVar367 * auVar181._12_4_) +
         auVar310._12_4_ * fVar118;
    auVar225._16_4_ =
         fVar369 * (auVar310._16_4_ * fVar199 + fVar369 * auVar181._0_4_) +
         auVar310._16_4_ * fVar119;
    auVar225._20_4_ =
         fVar301 * (auVar310._20_4_ * fVar202 + fVar301 * auVar181._4_4_) +
         auVar310._20_4_ * fVar311;
    auVar225._24_4_ =
         fVar302 * (auVar310._24_4_ * fVar229 + fVar302 * auVar181._8_4_) +
         auVar310._24_4_ * fVar321;
    auVar225._28_4_ = auVar181._12_4_ + 1.0 + fVar250;
    auVar248._0_4_ =
         fVar326 * (fVar335 * auVar310._0_4_ + auVar144._0_4_ * fVar326) + auVar310._0_4_ * fVar340;
    auVar248._4_4_ =
         fVar360 * (fVar346 * auVar310._4_4_ + auVar144._4_4_ * fVar360) + auVar310._4_4_ * fVar347;
    auVar248._8_4_ =
         fVar366 * (fVar348 * auVar310._8_4_ + auVar144._8_4_ * fVar366) + auVar310._8_4_ * fVar312;
    auVar248._12_4_ =
         fVar367 * (fVar322 * auVar310._12_4_ + auVar144._12_4_ * fVar367) +
         auVar310._12_4_ * fVar324;
    auVar248._16_4_ =
         fVar369 * (fVar335 * auVar310._16_4_ + auVar144._0_4_ * fVar369) +
         auVar310._16_4_ * fVar336;
    auVar248._20_4_ =
         fVar301 * (fVar346 * auVar310._20_4_ + auVar144._4_4_ * fVar301) +
         auVar310._20_4_ * fVar337;
    auVar248._24_4_ =
         fVar302 * (fVar348 * auVar310._24_4_ + auVar144._8_4_ * fVar302) +
         auVar310._24_4_ * fVar338;
    auVar248._28_4_ = auVar271._12_4_ + fVar250;
    auVar113._0_4_ =
         fVar326 * fVar251 + auVar310._0_4_ * (fVar325 * fVar326 + auVar263._0_4_ * auVar310._0_4_);
    auVar113._4_4_ =
         fVar360 * fVar252 + auVar310._4_4_ * (fVar327 * fVar360 + auVar263._4_4_ * auVar310._4_4_);
    auVar113._8_4_ =
         fVar366 * fVar117 + auVar310._8_4_ * (fVar333 * fVar366 + auVar263._8_4_ * auVar310._8_4_);
    auVar113._12_4_ =
         fVar367 * fVar118 +
         auVar310._12_4_ * (fVar334 * fVar367 + auVar263._12_4_ * auVar310._12_4_);
    auVar113._16_4_ =
         fVar369 * fVar119 +
         auVar310._16_4_ * (fVar325 * fVar369 + auVar263._0_4_ * auVar310._16_4_);
    auVar113._20_4_ =
         fVar301 * fVar311 +
         auVar310._20_4_ * (fVar327 * fVar301 + auVar263._4_4_ * auVar310._20_4_);
    auVar113._24_4_ =
         fVar302 * fVar321 +
         auVar310._24_4_ * (fVar333 * fVar302 + auVar263._8_4_ * auVar310._24_4_);
    auVar113._28_4_ = fVar233 + 1.0 + fVar323;
    auVar319._0_4_ =
         fVar326 * fVar340 + auVar310._0_4_ * (auVar271._0_4_ * auVar310._0_4_ + fVar326 * fVar200);
    auVar319._4_4_ =
         fVar360 * fVar347 + auVar310._4_4_ * (auVar271._4_4_ * auVar310._4_4_ + fVar360 * fVar227);
    auVar319._8_4_ =
         fVar366 * fVar312 + auVar310._8_4_ * (auVar271._8_4_ * auVar310._8_4_ + fVar366 * fVar231);
    auVar319._12_4_ =
         fVar367 * fVar324 +
         auVar310._12_4_ * (auVar271._12_4_ * auVar310._12_4_ + fVar367 * fVar250);
    auVar319._16_4_ =
         fVar369 * fVar336 +
         auVar310._16_4_ * (auVar271._0_4_ * auVar310._16_4_ + fVar369 * fVar200);
    auVar319._20_4_ =
         fVar301 * fVar337 +
         auVar310._20_4_ * (auVar271._4_4_ * auVar310._20_4_ + fVar301 * fVar227);
    auVar319._24_4_ =
         fVar302 * fVar338 +
         auVar310._24_4_ * (auVar271._8_4_ * auVar310._24_4_ + fVar302 * fVar231);
    auVar319._28_4_ = fVar323 + fVar250 + 0.0;
    local_d8._0_4_ = fVar326 * auVar225._0_4_ + auVar310._0_4_ * auVar113._0_4_;
    local_d8._4_4_ = fVar360 * auVar225._4_4_ + auVar310._4_4_ * auVar113._4_4_;
    local_d8._8_4_ = fVar366 * auVar225._8_4_ + auVar310._8_4_ * auVar113._8_4_;
    local_d8._12_4_ = fVar367 * auVar225._12_4_ + auVar310._12_4_ * auVar113._12_4_;
    local_d8._16_4_ = fVar369 * auVar225._16_4_ + auVar310._16_4_ * auVar113._16_4_;
    local_d8._20_4_ = fVar301 * auVar225._20_4_ + auVar310._20_4_ * auVar113._20_4_;
    local_d8._24_4_ = fVar302 * auVar225._24_4_ + auVar310._24_4_ * auVar113._24_4_;
    local_d8._28_4_ = fVar339 + fVar250 + 0.0;
    auVar197._0_4_ = fVar326 * auVar248._0_4_ + auVar310._0_4_ * auVar319._0_4_;
    auVar197._4_4_ = fVar360 * auVar248._4_4_ + auVar310._4_4_ * auVar319._4_4_;
    auVar197._8_4_ = fVar366 * auVar248._8_4_ + auVar310._8_4_ * auVar319._8_4_;
    auVar197._12_4_ = fVar367 * auVar248._12_4_ + auVar310._12_4_ * auVar319._12_4_;
    auVar197._16_4_ = fVar369 * auVar248._16_4_ + auVar310._16_4_ * auVar319._16_4_;
    auVar197._20_4_ = fVar301 * auVar248._20_4_ + auVar310._20_4_ * auVar319._20_4_;
    auVar197._24_4_ = fVar302 * auVar248._24_4_ + auVar310._24_4_ * auVar319._24_4_;
    auVar197._28_4_ = fVar339 + fVar323;
    auVar28 = vsubps_avx(auVar113,auVar225);
    auVar111 = vsubps_avx(auVar319,auVar248);
    local_538 = auVar98._0_4_;
    fStack_534 = auVar98._4_4_;
    fStack_530 = auVar98._8_4_;
    fStack_52c = auVar98._12_4_;
    local_118 = local_538 * auVar28._0_4_ * 3.0;
    fStack_114 = fStack_534 * auVar28._4_4_ * 3.0;
    auVar29._4_4_ = fStack_114;
    auVar29._0_4_ = local_118;
    fStack_110 = fStack_530 * auVar28._8_4_ * 3.0;
    auVar29._8_4_ = fStack_110;
    fStack_10c = fStack_52c * auVar28._12_4_ * 3.0;
    auVar29._12_4_ = fStack_10c;
    fStack_108 = local_538 * auVar28._16_4_ * 3.0;
    auVar29._16_4_ = fStack_108;
    fStack_104 = fStack_534 * auVar28._20_4_ * 3.0;
    auVar29._20_4_ = fStack_104;
    fStack_100 = fStack_530 * auVar28._24_4_ * 3.0;
    auVar29._24_4_ = fStack_100;
    auVar29._28_4_ = auVar28._28_4_;
    local_138 = local_538 * auVar111._0_4_ * 3.0;
    fStack_134 = fStack_534 * auVar111._4_4_ * 3.0;
    auVar30._4_4_ = fStack_134;
    auVar30._0_4_ = local_138;
    fStack_130 = fStack_530 * auVar111._8_4_ * 3.0;
    auVar30._8_4_ = fStack_130;
    fStack_12c = fStack_52c * auVar111._12_4_ * 3.0;
    auVar30._12_4_ = fStack_12c;
    fStack_128 = local_538 * auVar111._16_4_ * 3.0;
    auVar30._16_4_ = fStack_128;
    fStack_124 = fStack_534 * auVar111._20_4_ * 3.0;
    auVar30._20_4_ = fStack_124;
    fStack_120 = fStack_530 * auVar111._24_4_ * 3.0;
    auVar30._24_4_ = fStack_120;
    auVar30._28_4_ = fVar339;
    auVar29 = vsubps_avx(local_d8,auVar29);
    auVar111 = vperm2f128_avx(auVar29,auVar29,1);
    auVar111 = vshufps_avx(auVar111,auVar29,0x30);
    auVar111 = vshufps_avx(auVar29,auVar111,0x29);
    auVar30 = vsubps_avx(auVar197,auVar30);
    auVar29 = vperm2f128_avx(auVar30,auVar30,1);
    auVar29 = vshufps_avx(auVar29,auVar30,0x30);
    auVar30 = vshufps_avx(auVar30,auVar29,0x29);
    fVar337 = auVar167._0_4_;
    fVar338 = auVar167._4_4_;
    fVar368 = auVar167._8_4_;
    fVar233 = auVar204._12_4_;
    fVar327 = auVar133._0_4_;
    fVar334 = auVar133._4_4_;
    fVar340 = auVar133._8_4_;
    fVar347 = auVar133._12_4_;
    auVar98 = vshufps_avx(auVar267,auVar267,0xaa);
    fVar199 = auVar98._0_4_;
    fVar202 = auVar98._4_4_;
    fVar229 = auVar98._8_4_;
    fVar250 = auVar98._12_4_;
    fVar117 = auVar310._0_4_ * fVar199 + fVar337 * fVar326;
    fVar118 = auVar310._4_4_ * fVar202 + fVar338 * fVar360;
    fVar119 = auVar310._8_4_ * fVar229 + fVar368 * fVar366;
    fVar311 = auVar310._12_4_ * fVar250 + auVar167._12_4_ * fVar367;
    fVar321 = auVar310._16_4_ * fVar199 + fVar337 * fVar369;
    fVar323 = auVar310._20_4_ * fVar202 + fVar338 * fVar301;
    fVar325 = auVar310._24_4_ * fVar229 + fVar368 * fVar302;
    auVar98 = vshufps_avx(auVar267,auVar267,0xff);
    fVar200 = auVar98._0_4_;
    fVar227 = auVar98._4_4_;
    fVar231 = auVar98._8_4_;
    fVar251 = auVar98._12_4_;
    fVar333 = auVar310._0_4_ * fVar200 + fVar327 * fVar326;
    fVar335 = auVar310._4_4_ * fVar227 + fVar334 * fVar360;
    fVar346 = auVar310._8_4_ * fVar231 + fVar340 * fVar366;
    fVar348 = auVar310._12_4_ * fVar251 + fVar347 * fVar367;
    fVar312 = auVar310._16_4_ * fVar200 + fVar327 * fVar369;
    fVar322 = auVar310._20_4_ * fVar227 + fVar334 * fVar301;
    fVar324 = auVar310._24_4_ * fVar231 + fVar340 * fVar302;
    auVar98 = vshufps_avx(auVar214,auVar214,0xaa);
    fVar336 = auVar98._12_4_ + fVar250;
    auVar181 = vshufps_avx(auVar214,auVar214,0xff);
    fVar252 = auVar181._12_4_;
    auVar114._0_4_ =
         fVar326 * (fVar337 * auVar310._0_4_ + fVar326 * auVar204._0_4_) + auVar310._0_4_ * fVar117;
    auVar114._4_4_ =
         fVar360 * (fVar338 * auVar310._4_4_ + fVar360 * auVar204._4_4_) + auVar310._4_4_ * fVar118;
    auVar114._8_4_ =
         fVar366 * (fVar368 * auVar310._8_4_ + fVar366 * auVar204._8_4_) + auVar310._8_4_ * fVar119;
    auVar114._12_4_ =
         fVar367 * (auVar167._12_4_ * auVar310._12_4_ + fVar367 * fVar233) +
         auVar310._12_4_ * fVar311;
    auVar114._16_4_ =
         fVar369 * (fVar337 * auVar310._16_4_ + fVar369 * auVar204._0_4_) +
         auVar310._16_4_ * fVar321;
    auVar114._20_4_ =
         fVar301 * (fVar338 * auVar310._20_4_ + fVar301 * auVar204._4_4_) +
         auVar310._20_4_ * fVar323;
    auVar114._24_4_ =
         fVar302 * (fVar368 * auVar310._24_4_ + fVar302 * auVar204._8_4_) +
         auVar310._24_4_ * fVar325;
    auVar114._28_4_ = auVar30._28_4_ + fVar233 + fVar252;
    auVar147._0_4_ =
         fVar326 * (fVar327 * auVar310._0_4_ + auVar132._0_4_ * fVar326) + auVar310._0_4_ * fVar333;
    auVar147._4_4_ =
         fVar360 * (fVar334 * auVar310._4_4_ + auVar132._4_4_ * fVar360) + auVar310._4_4_ * fVar335;
    auVar147._8_4_ =
         fVar366 * (fVar340 * auVar310._8_4_ + auVar132._8_4_ * fVar366) + auVar310._8_4_ * fVar346;
    auVar147._12_4_ =
         fVar367 * (fVar347 * auVar310._12_4_ + auVar132._12_4_ * fVar367) +
         auVar310._12_4_ * fVar348;
    auVar147._16_4_ =
         fVar369 * (fVar327 * auVar310._16_4_ + auVar132._0_4_ * fVar369) +
         auVar310._16_4_ * fVar312;
    auVar147._20_4_ =
         fVar301 * (fVar334 * auVar310._20_4_ + auVar132._4_4_ * fVar301) +
         auVar310._20_4_ * fVar322;
    auVar147._24_4_ =
         fVar302 * (fVar340 * auVar310._24_4_ + auVar132._8_4_ * fVar302) +
         auVar310._24_4_ * fVar324;
    auVar147._28_4_ = fVar233 + auVar29._28_4_ + fVar252;
    auVar29 = vperm2f128_avx(local_d8,local_d8,1);
    auVar29 = vshufps_avx(auVar29,local_d8,0x30);
    auVar112 = vshufps_avx(local_d8,auVar29,0x29);
    auVar249._0_4_ =
         auVar310._0_4_ * (auVar98._0_4_ * auVar310._0_4_ + fVar326 * fVar199) + fVar326 * fVar117;
    auVar249._4_4_ =
         auVar310._4_4_ * (auVar98._4_4_ * auVar310._4_4_ + fVar360 * fVar202) + fVar360 * fVar118;
    auVar249._8_4_ =
         auVar310._8_4_ * (auVar98._8_4_ * auVar310._8_4_ + fVar366 * fVar229) + fVar366 * fVar119;
    auVar249._12_4_ =
         auVar310._12_4_ * (auVar98._12_4_ * auVar310._12_4_ + fVar367 * fVar250) +
         fVar367 * fVar311;
    auVar249._16_4_ =
         auVar310._16_4_ * (auVar98._0_4_ * auVar310._16_4_ + fVar369 * fVar199) + fVar369 * fVar321
    ;
    auVar249._20_4_ =
         auVar310._20_4_ * (auVar98._4_4_ * auVar310._20_4_ + fVar301 * fVar202) + fVar301 * fVar323
    ;
    auVar249._24_4_ =
         auVar310._24_4_ * (auVar98._8_4_ * auVar310._24_4_ + fVar302 * fVar229) + fVar302 * fVar325
    ;
    auVar249._28_4_ = fVar336 + fVar349 + auVar248._28_4_;
    auVar286._0_4_ =
         fVar326 * fVar333 + auVar310._0_4_ * (auVar310._0_4_ * auVar181._0_4_ + fVar326 * fVar200);
    auVar286._4_4_ =
         fVar360 * fVar335 + auVar310._4_4_ * (auVar310._4_4_ * auVar181._4_4_ + fVar360 * fVar227);
    auVar286._8_4_ =
         fVar366 * fVar346 + auVar310._8_4_ * (auVar310._8_4_ * auVar181._8_4_ + fVar366 * fVar231);
    auVar286._12_4_ =
         fVar367 * fVar348 + auVar310._12_4_ * (auVar310._12_4_ * fVar252 + fVar367 * fVar251);
    auVar286._16_4_ =
         fVar369 * fVar312 +
         auVar310._16_4_ * (auVar310._16_4_ * auVar181._0_4_ + fVar369 * fVar200);
    auVar286._20_4_ =
         fVar301 * fVar322 +
         auVar310._20_4_ * (auVar310._20_4_ * auVar181._4_4_ + fVar301 * fVar227);
    auVar286._24_4_ =
         fVar302 * fVar324 +
         auVar310._24_4_ * (auVar310._24_4_ * auVar181._8_4_ + fVar302 * fVar231);
    auVar286._28_4_ = fVar349 + fVar347 + fVar252 + fVar251;
    auVar270._0_4_ = fVar326 * auVar114._0_4_ + auVar310._0_4_ * auVar249._0_4_;
    auVar270._4_4_ = fVar360 * auVar114._4_4_ + auVar310._4_4_ * auVar249._4_4_;
    auVar270._8_4_ = fVar366 * auVar114._8_4_ + auVar310._8_4_ * auVar249._8_4_;
    auVar270._12_4_ = fVar367 * auVar114._12_4_ + auVar310._12_4_ * auVar249._12_4_;
    auVar270._16_4_ = fVar369 * auVar114._16_4_ + auVar310._16_4_ * auVar249._16_4_;
    auVar270._20_4_ = fVar301 * auVar114._20_4_ + auVar310._20_4_ * auVar249._20_4_;
    auVar270._24_4_ = fVar302 * auVar114._24_4_ + auVar310._24_4_ * auVar249._24_4_;
    auVar270._28_4_ = fVar336 + fVar252 + fVar251;
    auVar297._0_4_ = fVar326 * auVar147._0_4_ + auVar310._0_4_ * auVar286._0_4_;
    auVar297._4_4_ = fVar360 * auVar147._4_4_ + auVar310._4_4_ * auVar286._4_4_;
    auVar297._8_4_ = fVar366 * auVar147._8_4_ + auVar310._8_4_ * auVar286._8_4_;
    auVar297._12_4_ = fVar367 * auVar147._12_4_ + auVar310._12_4_ * auVar286._12_4_;
    auVar297._16_4_ = fVar369 * auVar147._16_4_ + auVar310._16_4_ * auVar286._16_4_;
    auVar297._20_4_ = fVar301 * auVar147._20_4_ + auVar310._20_4_ * auVar286._20_4_;
    auVar297._24_4_ = fVar302 * auVar147._24_4_ + auVar310._24_4_ * auVar286._24_4_;
    auVar297._28_4_ = auVar27._28_4_ + auVar310._28_4_;
    auVar31 = vsubps_avx(auVar249,auVar114);
    auVar29 = vsubps_avx(auVar286,auVar147);
    local_158 = local_538 * auVar31._0_4_ * 3.0;
    fStack_154 = fStack_534 * auVar31._4_4_ * 3.0;
    auVar27._4_4_ = fStack_154;
    auVar27._0_4_ = local_158;
    fStack_150 = fStack_530 * auVar31._8_4_ * 3.0;
    auVar27._8_4_ = fStack_150;
    fStack_14c = fStack_52c * auVar31._12_4_ * 3.0;
    auVar27._12_4_ = fStack_14c;
    fStack_148 = local_538 * auVar31._16_4_ * 3.0;
    auVar27._16_4_ = fStack_148;
    fStack_144 = fStack_534 * auVar31._20_4_ * 3.0;
    auVar27._20_4_ = fStack_144;
    fStack_140 = fStack_530 * auVar31._24_4_ * 3.0;
    auVar27._24_4_ = fStack_140;
    auVar27._28_4_ = auVar31._28_4_;
    local_178 = local_538 * auVar29._0_4_ * 3.0;
    fStack_174 = fStack_534 * auVar29._4_4_ * 3.0;
    auVar32._4_4_ = fStack_174;
    auVar32._0_4_ = local_178;
    fStack_170 = fStack_530 * auVar29._8_4_ * 3.0;
    auVar32._8_4_ = fStack_170;
    fStack_16c = fStack_52c * auVar29._12_4_ * 3.0;
    auVar32._12_4_ = fStack_16c;
    fStack_168 = local_538 * auVar29._16_4_ * 3.0;
    auVar32._16_4_ = fStack_168;
    fStack_164 = fStack_534 * auVar29._20_4_ * 3.0;
    auVar32._20_4_ = fStack_164;
    fStack_160 = fStack_530 * auVar29._24_4_ * 3.0;
    auVar32._24_4_ = fStack_160;
    auVar32._28_4_ = auVar249._28_4_;
    auVar29 = vperm2f128_avx(auVar270,auVar270,1);
    auVar29 = vshufps_avx(auVar29,auVar270,0x30);
    auVar113 = vshufps_avx(auVar270,auVar29,0x29);
    auVar27 = vsubps_avx(auVar270,auVar27);
    auVar29 = vperm2f128_avx(auVar27,auVar27,1);
    auVar29 = vshufps_avx(auVar29,auVar27,0x30);
    auVar29 = vshufps_avx(auVar27,auVar29,0x29);
    auVar32 = vsubps_avx(auVar297,auVar32);
    auVar27 = vperm2f128_avx(auVar32,auVar32,1);
    auVar27 = vshufps_avx(auVar27,auVar32,0x30);
    local_b8 = vshufps_avx(auVar32,auVar27,0x29);
    auVar33 = vsubps_avx(auVar270,local_d8);
    auVar114 = vsubps_avx(auVar113,auVar112);
    fVar199 = auVar114._0_4_ + auVar33._0_4_;
    fVar200 = auVar114._4_4_ + auVar33._4_4_;
    fVar202 = auVar114._8_4_ + auVar33._8_4_;
    fVar227 = auVar114._12_4_ + auVar33._12_4_;
    fVar229 = auVar114._16_4_ + auVar33._16_4_;
    fVar231 = auVar114._20_4_ + auVar33._20_4_;
    fVar233 = auVar114._24_4_ + auVar33._24_4_;
    auVar27 = vperm2f128_avx(auVar197,auVar197,1);
    auVar27 = vshufps_avx(auVar27,auVar197,0x30);
    local_f8 = vshufps_avx(auVar197,auVar27,0x29);
    auVar27 = vperm2f128_avx(auVar297,auVar297,1);
    auVar27 = vshufps_avx(auVar27,auVar297,0x30);
    auVar32 = vshufps_avx(auVar297,auVar27,0x29);
    auVar27 = vsubps_avx(auVar297,auVar197);
    auVar147 = vsubps_avx(auVar32,local_f8);
    fVar250 = auVar147._0_4_ + auVar27._0_4_;
    fVar251 = auVar147._4_4_ + auVar27._4_4_;
    fVar252 = auVar147._8_4_ + auVar27._8_4_;
    fVar117 = auVar147._12_4_ + auVar27._12_4_;
    fVar118 = auVar147._16_4_ + auVar27._16_4_;
    fVar119 = auVar147._20_4_ + auVar27._20_4_;
    fVar311 = auVar147._24_4_ + auVar27._24_4_;
    auVar34._4_4_ = fVar200 * auVar197._4_4_;
    auVar34._0_4_ = fVar199 * auVar197._0_4_;
    auVar34._8_4_ = fVar202 * auVar197._8_4_;
    auVar34._12_4_ = fVar227 * auVar197._12_4_;
    auVar34._16_4_ = fVar229 * auVar197._16_4_;
    auVar34._20_4_ = fVar231 * auVar197._20_4_;
    auVar34._24_4_ = fVar233 * auVar197._24_4_;
    auVar34._28_4_ = auVar27._28_4_;
    auVar35._4_4_ = fVar251 * local_d8._4_4_;
    auVar35._0_4_ = fVar250 * local_d8._0_4_;
    auVar35._8_4_ = fVar252 * local_d8._8_4_;
    auVar35._12_4_ = fVar117 * local_d8._12_4_;
    auVar35._16_4_ = fVar118 * local_d8._16_4_;
    auVar35._20_4_ = fVar119 * local_d8._20_4_;
    auVar35._24_4_ = fVar311 * local_d8._24_4_;
    auVar35._28_4_ = fVar336;
    auVar34 = vsubps_avx(auVar34,auVar35);
    local_118 = local_d8._0_4_ + local_118;
    fStack_114 = local_d8._4_4_ + fStack_114;
    fStack_110 = local_d8._8_4_ + fStack_110;
    fStack_10c = local_d8._12_4_ + fStack_10c;
    fStack_108 = local_d8._16_4_ + fStack_108;
    fStack_104 = local_d8._20_4_ + fStack_104;
    fStack_100 = local_d8._24_4_ + fStack_100;
    fStack_fc = local_d8._28_4_ + auVar28._28_4_;
    local_138 = local_138 + auVar197._0_4_;
    fStack_134 = fStack_134 + auVar197._4_4_;
    fStack_130 = fStack_130 + auVar197._8_4_;
    fStack_12c = fStack_12c + auVar197._12_4_;
    fStack_128 = fStack_128 + auVar197._16_4_;
    fStack_124 = fStack_124 + auVar197._20_4_;
    fStack_120 = fStack_120 + auVar197._24_4_;
    fStack_11c = fVar339 + auVar197._28_4_;
    auVar28._4_4_ = fVar200 * fStack_134;
    auVar28._0_4_ = fVar199 * local_138;
    auVar28._8_4_ = fVar202 * fStack_130;
    auVar28._12_4_ = fVar227 * fStack_12c;
    auVar28._16_4_ = fVar229 * fStack_128;
    auVar28._20_4_ = fVar231 * fStack_124;
    auVar28._24_4_ = fVar233 * fStack_120;
    auVar28._28_4_ = fVar339;
    auVar36._4_4_ = fVar251 * fStack_114;
    auVar36._0_4_ = fVar250 * local_118;
    auVar36._8_4_ = fVar252 * fStack_110;
    auVar36._12_4_ = fVar117 * fStack_10c;
    auVar36._16_4_ = fVar118 * fStack_108;
    auVar36._20_4_ = fVar119 * fStack_104;
    auVar36._24_4_ = fVar311 * fStack_100;
    auVar36._28_4_ = fVar339 + auVar197._28_4_;
    auVar28 = vsubps_avx(auVar28,auVar36);
    local_518 = auVar30._0_4_;
    fStack_514 = auVar30._4_4_;
    fStack_510 = auVar30._8_4_;
    fStack_50c = auVar30._12_4_;
    fStack_508 = auVar30._16_4_;
    fStack_504 = auVar30._20_4_;
    fStack_500 = auVar30._24_4_;
    auVar37._4_4_ = fVar200 * fStack_514;
    auVar37._0_4_ = fVar199 * local_518;
    auVar37._8_4_ = fVar202 * fStack_510;
    auVar37._12_4_ = fVar227 * fStack_50c;
    auVar37._16_4_ = fVar229 * fStack_508;
    auVar37._20_4_ = fVar231 * fStack_504;
    auVar37._24_4_ = fVar233 * fStack_500;
    auVar37._28_4_ = fVar339;
    local_5e8._0_4_ = auVar111._0_4_;
    local_5e8._4_4_ = auVar111._4_4_;
    fStack_5e0 = auVar111._8_4_;
    fStack_5dc = auVar111._12_4_;
    fStack_5d8 = auVar111._16_4_;
    fStack_5d4 = auVar111._20_4_;
    fStack_5d0 = auVar111._24_4_;
    auVar38._4_4_ = fVar251 * (float)local_5e8._4_4_;
    auVar38._0_4_ = fVar250 * (float)local_5e8._0_4_;
    auVar38._8_4_ = fVar252 * fStack_5e0;
    auVar38._12_4_ = fVar117 * fStack_5dc;
    auVar38._16_4_ = fVar118 * fStack_5d8;
    auVar38._20_4_ = fVar119 * fStack_5d4;
    auVar38._24_4_ = fVar311 * fStack_5d0;
    auVar38._28_4_ = local_d8._28_4_;
    auVar35 = vsubps_avx(auVar37,auVar38);
    auVar39._4_4_ = local_f8._4_4_ * fVar200;
    auVar39._0_4_ = local_f8._0_4_ * fVar199;
    auVar39._8_4_ = local_f8._8_4_ * fVar202;
    auVar39._12_4_ = local_f8._12_4_ * fVar227;
    auVar39._16_4_ = local_f8._16_4_ * fVar229;
    auVar39._20_4_ = local_f8._20_4_ * fVar231;
    auVar39._24_4_ = local_f8._24_4_ * fVar233;
    auVar39._28_4_ = fVar339;
    auVar40._4_4_ = auVar112._4_4_ * fVar251;
    auVar40._0_4_ = auVar112._0_4_ * fVar250;
    auVar40._8_4_ = auVar112._8_4_ * fVar252;
    auVar40._12_4_ = auVar112._12_4_ * fVar117;
    auVar40._16_4_ = auVar112._16_4_ * fVar118;
    auVar40._20_4_ = auVar112._20_4_ * fVar119;
    auVar40._24_4_ = auVar112._24_4_ * fVar311;
    auVar40._28_4_ = local_f8._28_4_;
    local_538 = auVar29._0_4_;
    fStack_534 = auVar29._4_4_;
    fStack_530 = auVar29._8_4_;
    fStack_52c = auVar29._12_4_;
    fStack_528 = auVar29._16_4_;
    fStack_524 = auVar29._20_4_;
    fStack_520 = auVar29._24_4_;
    auVar36 = vsubps_avx(auVar39,auVar40);
    auVar41._4_4_ = auVar297._4_4_ * fVar200;
    auVar41._0_4_ = auVar297._0_4_ * fVar199;
    auVar41._8_4_ = auVar297._8_4_ * fVar202;
    auVar41._12_4_ = auVar297._12_4_ * fVar227;
    auVar41._16_4_ = auVar297._16_4_ * fVar229;
    auVar41._20_4_ = auVar297._20_4_ * fVar231;
    auVar41._24_4_ = auVar297._24_4_ * fVar233;
    auVar41._28_4_ = fVar339;
    auVar42._4_4_ = fVar251 * auVar270._4_4_;
    auVar42._0_4_ = fVar250 * auVar270._0_4_;
    auVar42._8_4_ = fVar252 * auVar270._8_4_;
    auVar42._12_4_ = fVar117 * auVar270._12_4_;
    auVar42._16_4_ = fVar118 * auVar270._16_4_;
    auVar42._20_4_ = fVar119 * auVar270._20_4_;
    auVar42._24_4_ = fVar311 * auVar270._24_4_;
    auVar42._28_4_ = fStack_fc;
    auVar37 = vsubps_avx(auVar41,auVar42);
    local_158 = auVar270._0_4_ + local_158;
    fStack_154 = auVar270._4_4_ + fStack_154;
    fStack_150 = auVar270._8_4_ + fStack_150;
    fStack_14c = auVar270._12_4_ + fStack_14c;
    fStack_148 = auVar270._16_4_ + fStack_148;
    fStack_144 = auVar270._20_4_ + fStack_144;
    fStack_140 = auVar270._24_4_ + fStack_140;
    fStack_13c = auVar270._28_4_ + auVar31._28_4_;
    local_178 = auVar297._0_4_ + local_178;
    fStack_174 = auVar297._4_4_ + fStack_174;
    fStack_170 = auVar297._8_4_ + fStack_170;
    fStack_16c = auVar297._12_4_ + fStack_16c;
    fStack_168 = auVar297._16_4_ + fStack_168;
    fStack_164 = auVar297._20_4_ + fStack_164;
    fStack_160 = auVar297._24_4_ + fStack_160;
    fStack_15c = auVar297._28_4_ + auVar249._28_4_;
    auVar31._4_4_ = fVar200 * fStack_174;
    auVar31._0_4_ = fVar199 * local_178;
    auVar31._8_4_ = fVar202 * fStack_170;
    auVar31._12_4_ = fVar227 * fStack_16c;
    auVar31._16_4_ = fVar229 * fStack_168;
    auVar31._20_4_ = fVar231 * fStack_164;
    auVar31._24_4_ = fVar233 * fStack_160;
    auVar31._28_4_ = auVar297._28_4_ + auVar249._28_4_;
    auVar43._4_4_ = fStack_154 * fVar251;
    auVar43._0_4_ = local_158 * fVar250;
    auVar43._8_4_ = fStack_150 * fVar252;
    auVar43._12_4_ = fStack_14c * fVar117;
    auVar43._16_4_ = fStack_148 * fVar118;
    auVar43._20_4_ = fStack_144 * fVar119;
    auVar43._24_4_ = fStack_140 * fVar311;
    auVar43._28_4_ = fStack_13c;
    auVar31 = vsubps_avx(auVar31,auVar43);
    auVar44._4_4_ = fVar200 * local_b8._4_4_;
    auVar44._0_4_ = fVar199 * local_b8._0_4_;
    auVar44._8_4_ = fVar202 * local_b8._8_4_;
    auVar44._12_4_ = fVar227 * local_b8._12_4_;
    auVar44._16_4_ = fVar229 * local_b8._16_4_;
    auVar44._20_4_ = fVar231 * local_b8._20_4_;
    auVar44._24_4_ = fVar233 * local_b8._24_4_;
    auVar44._28_4_ = fStack_13c;
    auVar45._4_4_ = fVar251 * fStack_534;
    auVar45._0_4_ = fVar250 * local_538;
    auVar45._8_4_ = fVar252 * fStack_530;
    auVar45._12_4_ = fVar117 * fStack_52c;
    auVar45._16_4_ = fVar118 * fStack_528;
    auVar45._20_4_ = fVar119 * fStack_524;
    auVar45._24_4_ = fVar311 * fStack_520;
    auVar45._28_4_ = local_b8._28_4_;
    auVar38 = vsubps_avx(auVar44,auVar45);
    auVar46._4_4_ = fVar200 * auVar32._4_4_;
    auVar46._0_4_ = fVar199 * auVar32._0_4_;
    auVar46._8_4_ = fVar202 * auVar32._8_4_;
    auVar46._12_4_ = fVar227 * auVar32._12_4_;
    auVar46._16_4_ = fVar229 * auVar32._16_4_;
    auVar46._20_4_ = fVar231 * auVar32._20_4_;
    auVar46._24_4_ = fVar233 * auVar32._24_4_;
    auVar46._28_4_ = auVar114._28_4_ + auVar33._28_4_;
    auVar33._4_4_ = auVar113._4_4_ * fVar251;
    auVar33._0_4_ = auVar113._0_4_ * fVar250;
    auVar33._8_4_ = auVar113._8_4_ * fVar252;
    auVar33._12_4_ = auVar113._12_4_ * fVar117;
    auVar33._16_4_ = auVar113._16_4_ * fVar118;
    auVar33._20_4_ = auVar113._20_4_ * fVar119;
    auVar33._24_4_ = auVar113._24_4_ * fVar311;
    auVar33._28_4_ = auVar147._28_4_ + auVar27._28_4_;
    auVar33 = vsubps_avx(auVar46,auVar33);
    auVar29 = vminps_avx(auVar34,auVar28);
    auVar111 = vmaxps_avx(auVar34,auVar28);
    auVar30 = vminps_avx(auVar35,auVar36);
    auVar30 = vminps_avx(auVar29,auVar30);
    auVar29 = vmaxps_avx(auVar35,auVar36);
    auVar111 = vmaxps_avx(auVar111,auVar29);
    auVar27 = vminps_avx(auVar37,auVar31);
    auVar29 = vmaxps_avx(auVar37,auVar31);
    auVar28 = vminps_avx(auVar38,auVar33);
    auVar28 = vminps_avx(auVar27,auVar28);
    auVar28 = vminps_avx(auVar30,auVar28);
    auVar30 = vmaxps_avx(auVar38,auVar33);
    auVar29 = vmaxps_avx(auVar29,auVar30);
    auVar29 = vmaxps_avx(auVar111,auVar29);
    auVar111 = vcmpps_avx(auVar28,local_78,2);
    auVar29 = vcmpps_avx(auVar29,local_98,5);
    auVar111 = vandps_avx(auVar29,auVar111);
    auVar29 = local_198 & auVar111;
    if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar29 >> 0x7f,0) != '\0') ||
          (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar29 >> 0xbf,0) != '\0') ||
        (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar29[0x1f] < '\0')
    {
      auVar29 = vsubps_avx(auVar112,local_d8);
      auVar30 = vsubps_avx(auVar113,auVar270);
      fVar200 = auVar29._0_4_ + auVar30._0_4_;
      fVar202 = auVar29._4_4_ + auVar30._4_4_;
      fVar227 = auVar29._8_4_ + auVar30._8_4_;
      fVar229 = auVar29._12_4_ + auVar30._12_4_;
      fVar231 = auVar29._16_4_ + auVar30._16_4_;
      fVar233 = auVar29._20_4_ + auVar30._20_4_;
      fVar250 = auVar29._24_4_ + auVar30._24_4_;
      auVar28 = vsubps_avx(local_f8,auVar197);
      auVar31 = vsubps_avx(auVar32,auVar297);
      fVar251 = auVar28._0_4_ + auVar31._0_4_;
      fVar252 = auVar28._4_4_ + auVar31._4_4_;
      fVar117 = auVar28._8_4_ + auVar31._8_4_;
      fVar118 = auVar28._12_4_ + auVar31._12_4_;
      fVar119 = auVar28._16_4_ + auVar31._16_4_;
      fVar311 = auVar28._20_4_ + auVar31._20_4_;
      fVar321 = auVar28._24_4_ + auVar31._24_4_;
      fVar199 = auVar31._28_4_;
      auVar47._4_4_ = auVar197._4_4_ * fVar202;
      auVar47._0_4_ = auVar197._0_4_ * fVar200;
      auVar47._8_4_ = auVar197._8_4_ * fVar227;
      auVar47._12_4_ = auVar197._12_4_ * fVar229;
      auVar47._16_4_ = auVar197._16_4_ * fVar231;
      auVar47._20_4_ = auVar197._20_4_ * fVar233;
      auVar47._24_4_ = auVar197._24_4_ * fVar250;
      auVar47._28_4_ = auVar197._28_4_;
      auVar48._4_4_ = local_d8._4_4_ * fVar252;
      auVar48._0_4_ = local_d8._0_4_ * fVar251;
      auVar48._8_4_ = local_d8._8_4_ * fVar117;
      auVar48._12_4_ = local_d8._12_4_ * fVar118;
      auVar48._16_4_ = local_d8._16_4_ * fVar119;
      auVar48._20_4_ = local_d8._20_4_ * fVar311;
      auVar48._24_4_ = local_d8._24_4_ * fVar321;
      auVar48._28_4_ = local_d8._28_4_;
      auVar31 = vsubps_avx(auVar47,auVar48);
      auVar49._4_4_ = fVar202 * fStack_134;
      auVar49._0_4_ = fVar200 * local_138;
      auVar49._8_4_ = fVar227 * fStack_130;
      auVar49._12_4_ = fVar229 * fStack_12c;
      auVar49._16_4_ = fVar231 * fStack_128;
      auVar49._20_4_ = fVar233 * fStack_124;
      auVar49._24_4_ = fVar250 * fStack_120;
      auVar49._28_4_ = auVar197._28_4_;
      auVar50._4_4_ = fVar252 * fStack_114;
      auVar50._0_4_ = fVar251 * local_118;
      auVar50._8_4_ = fVar117 * fStack_110;
      auVar50._12_4_ = fVar118 * fStack_10c;
      auVar50._16_4_ = fVar119 * fStack_108;
      auVar50._20_4_ = fVar311 * fStack_104;
      auVar50._24_4_ = fVar321 * fStack_100;
      auVar50._28_4_ = fVar199;
      auVar33 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fVar202 * fStack_514;
      auVar51._0_4_ = fVar200 * local_518;
      auVar51._8_4_ = fVar227 * fStack_510;
      auVar51._12_4_ = fVar229 * fStack_50c;
      auVar51._16_4_ = fVar231 * fStack_508;
      auVar51._20_4_ = fVar233 * fStack_504;
      auVar51._24_4_ = fVar250 * fStack_500;
      auVar51._28_4_ = fVar199;
      auVar52._4_4_ = fVar252 * (float)local_5e8._4_4_;
      auVar52._0_4_ = fVar251 * (float)local_5e8._0_4_;
      auVar52._8_4_ = fVar117 * fStack_5e0;
      auVar52._12_4_ = fVar118 * fStack_5dc;
      auVar52._16_4_ = fVar119 * fStack_5d8;
      auVar52._20_4_ = fVar311 * fStack_5d4;
      auVar52._24_4_ = fVar321 * fStack_5d0;
      auVar52._28_4_ = auVar27._28_4_;
      auVar114 = vsubps_avx(auVar51,auVar52);
      auVar53._4_4_ = local_f8._4_4_ * fVar202;
      auVar53._0_4_ = local_f8._0_4_ * fVar200;
      auVar53._8_4_ = local_f8._8_4_ * fVar227;
      auVar53._12_4_ = local_f8._12_4_ * fVar229;
      auVar53._16_4_ = local_f8._16_4_ * fVar231;
      auVar53._20_4_ = local_f8._20_4_ * fVar233;
      auVar53._24_4_ = local_f8._24_4_ * fVar250;
      auVar53._28_4_ = auVar27._28_4_;
      auVar54._4_4_ = auVar112._4_4_ * fVar252;
      auVar54._0_4_ = auVar112._0_4_ * fVar251;
      auVar54._8_4_ = auVar112._8_4_ * fVar117;
      auVar54._12_4_ = auVar112._12_4_ * fVar118;
      auVar54._16_4_ = auVar112._16_4_ * fVar119;
      auVar54._20_4_ = auVar112._20_4_ * fVar311;
      uVar8 = auVar112._28_4_;
      auVar54._24_4_ = auVar112._24_4_ * fVar321;
      auVar54._28_4_ = uVar8;
      auVar112 = vsubps_avx(auVar53,auVar54);
      auVar55._4_4_ = auVar297._4_4_ * fVar202;
      auVar55._0_4_ = auVar297._0_4_ * fVar200;
      auVar55._8_4_ = auVar297._8_4_ * fVar227;
      auVar55._12_4_ = auVar297._12_4_ * fVar229;
      auVar55._16_4_ = auVar297._16_4_ * fVar231;
      auVar55._20_4_ = auVar297._20_4_ * fVar233;
      auVar55._24_4_ = auVar297._24_4_ * fVar250;
      auVar55._28_4_ = uVar8;
      auVar56._4_4_ = auVar270._4_4_ * fVar252;
      auVar56._0_4_ = auVar270._0_4_ * fVar251;
      auVar56._8_4_ = auVar270._8_4_ * fVar117;
      auVar56._12_4_ = auVar270._12_4_ * fVar118;
      auVar56._16_4_ = auVar270._16_4_ * fVar119;
      auVar56._20_4_ = auVar270._20_4_ * fVar311;
      auVar56._24_4_ = auVar270._24_4_ * fVar321;
      auVar56._28_4_ = auVar270._28_4_;
      auVar147 = vsubps_avx(auVar55,auVar56);
      auVar57._4_4_ = fVar202 * fStack_174;
      auVar57._0_4_ = fVar200 * local_178;
      auVar57._8_4_ = fVar227 * fStack_170;
      auVar57._12_4_ = fVar229 * fStack_16c;
      auVar57._16_4_ = fVar231 * fStack_168;
      auVar57._20_4_ = fVar233 * fStack_164;
      auVar57._24_4_ = fVar250 * fStack_160;
      auVar57._28_4_ = uVar8;
      auVar58._4_4_ = fVar252 * fStack_154;
      auVar58._0_4_ = fVar251 * local_158;
      auVar58._8_4_ = fVar117 * fStack_150;
      auVar58._12_4_ = fVar118 * fStack_14c;
      auVar58._16_4_ = fVar119 * fStack_148;
      auVar58._20_4_ = fVar311 * fStack_144;
      auVar58._24_4_ = fVar321 * fStack_140;
      auVar58._28_4_ = auVar297._28_4_;
      auVar34 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = fVar202 * local_b8._4_4_;
      auVar59._0_4_ = fVar200 * local_b8._0_4_;
      auVar59._8_4_ = fVar227 * local_b8._8_4_;
      auVar59._12_4_ = fVar229 * local_b8._12_4_;
      auVar59._16_4_ = fVar231 * local_b8._16_4_;
      auVar59._20_4_ = fVar233 * local_b8._20_4_;
      auVar59._24_4_ = fVar250 * local_b8._24_4_;
      auVar59._28_4_ = auVar297._28_4_;
      auVar60._4_4_ = fStack_534 * fVar252;
      auVar60._0_4_ = local_538 * fVar251;
      auVar60._8_4_ = fStack_530 * fVar117;
      auVar60._12_4_ = fStack_52c * fVar118;
      auVar60._16_4_ = fStack_528 * fVar119;
      auVar60._20_4_ = fStack_524 * fVar311;
      auVar60._24_4_ = fStack_520 * fVar321;
      auVar60._28_4_ = local_f8._28_4_;
      auVar35 = vsubps_avx(auVar59,auVar60);
      auVar61._4_4_ = fVar202 * auVar32._4_4_;
      auVar61._0_4_ = fVar200 * auVar32._0_4_;
      auVar61._8_4_ = fVar227 * auVar32._8_4_;
      auVar61._12_4_ = fVar229 * auVar32._12_4_;
      auVar61._16_4_ = fVar231 * auVar32._16_4_;
      auVar61._20_4_ = fVar233 * auVar32._20_4_;
      auVar61._24_4_ = fVar250 * auVar32._24_4_;
      auVar61._28_4_ = auVar29._28_4_ + auVar30._28_4_;
      auVar62._4_4_ = auVar113._4_4_ * fVar252;
      auVar62._0_4_ = auVar113._0_4_ * fVar251;
      auVar62._8_4_ = auVar113._8_4_ * fVar117;
      auVar62._12_4_ = auVar113._12_4_ * fVar118;
      auVar62._16_4_ = auVar113._16_4_ * fVar119;
      auVar62._20_4_ = auVar113._20_4_ * fVar311;
      auVar62._24_4_ = auVar113._24_4_ * fVar321;
      auVar62._28_4_ = auVar28._28_4_ + fVar199;
      auVar113 = vsubps_avx(auVar61,auVar62);
      auVar30 = vminps_avx(auVar31,auVar33);
      auVar29 = vmaxps_avx(auVar31,auVar33);
      auVar27 = vminps_avx(auVar114,auVar112);
      auVar27 = vminps_avx(auVar30,auVar27);
      auVar30 = vmaxps_avx(auVar114,auVar112);
      auVar29 = vmaxps_avx(auVar29,auVar30);
      auVar28 = vminps_avx(auVar147,auVar34);
      auVar30 = vmaxps_avx(auVar147,auVar34);
      auVar112 = vminps_avx(auVar35,auVar113);
      auVar28 = vminps_avx(auVar28,auVar112);
      auVar28 = vminps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(auVar35,auVar113);
      auVar30 = vmaxps_avx(auVar30,auVar27);
      auVar30 = vmaxps_avx(auVar29,auVar30);
      auVar29 = vcmpps_avx(auVar28,local_78,2);
      auVar30 = vcmpps_avx(auVar30,local_98,5);
      auVar29 = vandps_avx(auVar30,auVar29);
      auVar111 = vandps_avx(local_198,auVar111);
      auVar30 = auVar111 & auVar29;
      if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar30 >> 0x7f,0) != '\0') ||
            (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0xbf,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar30[0x1f] < '\0') {
        auVar111 = vandps_avx(auVar29,auVar111);
        uVar70 = vmovmskps_avx(auVar111);
        if (uVar70 != 0) {
          mask_stack[uVar72] = uVar70 & 0xff;
          BVar9 = (BBox1f)vmovlps_avx(auVar289);
          cu_stack[uVar72] = BVar9;
          BVar9 = (BBox1f)vmovlps_avx(auVar272);
          cv_stack[uVar72] = BVar9;
          uVar72 = (ulong)((int)uVar72 + 1);
        }
      }
    }
LAB_008b8d66:
    do {
      do {
        do {
          do {
            if ((int)uVar72 == 0) {
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar110._4_4_ = uVar8;
              auVar110._0_4_ = uVar8;
              auVar110._8_4_ = uVar8;
              auVar110._12_4_ = uVar8;
              auVar161 = vcmpps_avx(auVar234,auVar110,2);
              uVar71 = vmovmskps_avx(auVar161);
              uVar77 = uVar77 & uVar77 + 0xf & uVar71;
              auVar64 = ZEXT812(0) << 0x20;
              goto LAB_008b7b1a;
            }
            uVar73 = (int)uVar72 - 1;
            uVar70 = mask_stack[uVar73];
            fVar199 = cu_stack[uVar73].lower;
            fVar200 = cu_stack[uVar73].upper;
            auVar314._8_8_ = 0;
            auVar314._0_4_ = cv_stack[uVar73].lower;
            auVar314._4_4_ = cv_stack[uVar73].upper;
            auVar320 = ZEXT1664(auVar314);
            uVar18 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar70 = uVar70 - 1 & uVar70;
            mask_stack[uVar73] = uVar70;
            if (uVar70 == 0) {
              uVar72 = (ulong)uVar73;
            }
            fVar227 = (float)(uVar18 + 1) * 0.14285715;
            fVar202 = (1.0 - (float)uVar18 * 0.14285715) * fVar199 +
                      fVar200 * (float)uVar18 * 0.14285715;
            fVar199 = (1.0 - fVar227) * fVar199 + fVar200 * fVar227;
            fVar200 = fVar199 - fVar202;
            if (0.16666667 <= fVar200) {
              auVar98 = vinsertps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar199),0x10);
              auVar365 = ZEXT1664(auVar98);
              goto LAB_008b870c;
            }
            auVar98 = vshufps_avx(auVar314,auVar314,0x50);
            auVar130._8_4_ = 0x3f800000;
            auVar130._0_8_ = 0x3f8000003f800000;
            auVar130._12_4_ = 0x3f800000;
            auVar204 = vsubps_avx(auVar130,auVar98);
            fVar227 = auVar98._0_4_;
            fVar229 = auVar98._4_4_;
            fVar231 = auVar98._8_4_;
            fVar233 = auVar98._12_4_;
            fVar250 = auVar204._0_4_;
            fVar251 = auVar204._4_4_;
            fVar252 = auVar204._8_4_;
            fVar117 = auVar204._12_4_;
            auVar165._0_4_ = fVar227 * auVar282._0_4_ + fVar250 * (float)local_608._0_4_;
            auVar165._4_4_ = fVar229 * auVar282._4_4_ + fVar251 * (float)local_608._4_4_;
            auVar165._8_4_ = fVar231 * auVar282._0_4_ + fVar252 * (float)local_608._0_4_;
            auVar165._12_4_ = fVar233 * auVar282._4_4_ + fVar117 * (float)local_608._4_4_;
            auVar215._0_4_ = auVar292._0_4_ * fVar227 + fVar203 * fVar250;
            auVar215._4_4_ = auVar292._4_4_ * fVar229 + fVar230 * fVar251;
            auVar215._8_4_ = auVar292._0_4_ * fVar231 + fVar203 * fVar252;
            auVar215._12_4_ = auVar292._4_4_ * fVar233 + fVar230 * fVar117;
            auVar242._0_4_ = auVar306._0_4_ * fVar227 + auVar213._0_4_ * fVar250;
            auVar242._4_4_ = auVar306._4_4_ * fVar229 + auVar213._4_4_ * fVar251;
            auVar242._8_4_ = auVar306._0_4_ * fVar231 + auVar213._0_4_ * fVar252;
            auVar242._12_4_ = auVar306._4_4_ * fVar233 + auVar213._4_4_ * fVar117;
            auVar95._0_4_ = auVar93._0_4_ * fVar227 + auVar129._0_4_ * fVar250;
            auVar95._4_4_ = auVar93._4_4_ * fVar229 + auVar129._4_4_ * fVar251;
            auVar95._8_4_ = auVar93._0_4_ * fVar231 + auVar129._0_4_ * fVar252;
            auVar95._12_4_ = auVar93._4_4_ * fVar233 + auVar129._4_4_ * fVar117;
            auVar148._16_16_ = auVar165;
            auVar148._0_16_ = auVar165;
            auVar182._16_16_ = auVar215;
            auVar182._0_16_ = auVar215;
            auVar226._16_16_ = auVar242;
            auVar226._0_16_ = auVar242;
            auVar111 = ZEXT2032(CONCAT416(fVar199,ZEXT416((uint)fVar202)));
            auVar111 = vshufps_avx(auVar111,auVar111,0);
            auVar29 = vsubps_avx(auVar182,auVar148);
            fVar227 = auVar111._0_4_;
            fVar229 = auVar111._4_4_;
            fVar231 = auVar111._8_4_;
            fVar233 = auVar111._12_4_;
            fVar250 = auVar111._16_4_;
            fVar251 = auVar111._20_4_;
            fVar252 = auVar111._24_4_;
            auVar149._0_4_ = auVar165._0_4_ + auVar29._0_4_ * fVar227;
            auVar149._4_4_ = auVar165._4_4_ + auVar29._4_4_ * fVar229;
            auVar149._8_4_ = auVar165._8_4_ + auVar29._8_4_ * fVar231;
            auVar149._12_4_ = auVar165._12_4_ + auVar29._12_4_ * fVar233;
            auVar149._16_4_ = auVar165._0_4_ + auVar29._16_4_ * fVar250;
            auVar149._20_4_ = auVar165._4_4_ + auVar29._20_4_ * fVar251;
            auVar149._24_4_ = auVar165._8_4_ + auVar29._24_4_ * fVar252;
            auVar149._28_4_ = auVar165._12_4_ + auVar29._28_4_;
            auVar111 = vsubps_avx(auVar226,auVar182);
            auVar183._0_4_ = auVar215._0_4_ + auVar111._0_4_ * fVar227;
            auVar183._4_4_ = auVar215._4_4_ + auVar111._4_4_ * fVar229;
            auVar183._8_4_ = auVar215._8_4_ + auVar111._8_4_ * fVar231;
            auVar183._12_4_ = auVar215._12_4_ + auVar111._12_4_ * fVar233;
            auVar183._16_4_ = auVar215._0_4_ + auVar111._16_4_ * fVar250;
            auVar183._20_4_ = auVar215._4_4_ + auVar111._20_4_ * fVar251;
            auVar183._24_4_ = auVar215._8_4_ + auVar111._24_4_ * fVar252;
            auVar183._28_4_ = auVar215._12_4_ + auVar111._28_4_;
            auVar98 = vsubps_avx(auVar95,auVar242);
            auVar115._0_4_ = auVar242._0_4_ + auVar98._0_4_ * fVar227;
            auVar115._4_4_ = auVar242._4_4_ + auVar98._4_4_ * fVar229;
            auVar115._8_4_ = auVar242._8_4_ + auVar98._8_4_ * fVar231;
            auVar115._12_4_ = auVar242._12_4_ + auVar98._12_4_ * fVar233;
            auVar115._16_4_ = auVar242._0_4_ + auVar98._0_4_ * fVar250;
            auVar115._20_4_ = auVar242._4_4_ + auVar98._4_4_ * fVar251;
            auVar115._24_4_ = auVar242._8_4_ + auVar98._8_4_ * fVar252;
            auVar115._28_4_ = auVar242._12_4_ + auVar98._12_4_;
            auVar111 = vsubps_avx(auVar183,auVar149);
            auVar150._0_4_ = auVar149._0_4_ + fVar227 * auVar111._0_4_;
            auVar150._4_4_ = auVar149._4_4_ + fVar229 * auVar111._4_4_;
            auVar150._8_4_ = auVar149._8_4_ + fVar231 * auVar111._8_4_;
            auVar150._12_4_ = auVar149._12_4_ + fVar233 * auVar111._12_4_;
            auVar150._16_4_ = auVar149._16_4_ + fVar250 * auVar111._16_4_;
            auVar150._20_4_ = auVar149._20_4_ + fVar251 * auVar111._20_4_;
            auVar150._24_4_ = auVar149._24_4_ + fVar252 * auVar111._24_4_;
            auVar150._28_4_ = auVar149._28_4_ + auVar111._28_4_;
            auVar111 = vsubps_avx(auVar115,auVar183);
            auVar116._0_4_ = auVar183._0_4_ + fVar227 * auVar111._0_4_;
            auVar116._4_4_ = auVar183._4_4_ + fVar229 * auVar111._4_4_;
            auVar116._8_4_ = auVar183._8_4_ + fVar231 * auVar111._8_4_;
            auVar116._12_4_ = auVar183._12_4_ + fVar233 * auVar111._12_4_;
            auVar116._16_4_ = auVar183._16_4_ + fVar250 * auVar111._16_4_;
            auVar116._20_4_ = auVar183._20_4_ + fVar251 * auVar111._20_4_;
            auVar116._24_4_ = auVar183._24_4_ + fVar252 * auVar111._24_4_;
            auVar116._28_4_ = auVar183._28_4_ + auVar111._28_4_;
            auVar111 = vsubps_avx(auVar116,auVar150);
            auVar256._0_4_ = auVar150._0_4_ + fVar227 * auVar111._0_4_;
            auVar256._4_4_ = auVar150._4_4_ + fVar229 * auVar111._4_4_;
            auVar256._8_4_ = auVar150._8_4_ + fVar231 * auVar111._8_4_;
            auVar256._12_4_ = auVar150._12_4_ + fVar233 * auVar111._12_4_;
            auVar261._16_4_ = auVar150._16_4_ + fVar250 * auVar111._16_4_;
            auVar261._0_16_ = auVar256;
            auVar261._20_4_ = auVar150._20_4_ + fVar251 * auVar111._20_4_;
            auVar261._24_4_ = auVar150._24_4_ + fVar252 * auVar111._24_4_;
            auVar261._28_4_ = auVar150._28_4_ + auVar183._28_4_;
            auVar262 = auVar261._16_16_;
            auVar132 = vshufps_avx(ZEXT416((uint)(fVar200 * 0.33333334)),
                                   ZEXT416((uint)(fVar200 * 0.33333334)),0);
            auVar216._0_4_ = auVar256._0_4_ + auVar132._0_4_ * auVar111._0_4_ * 3.0;
            auVar216._4_4_ = auVar256._4_4_ + auVar132._4_4_ * auVar111._4_4_ * 3.0;
            auVar216._8_4_ = auVar256._8_4_ + auVar132._8_4_ * auVar111._8_4_ * 3.0;
            auVar216._12_4_ = auVar256._12_4_ + auVar132._12_4_ * auVar111._12_4_ * 3.0;
            auVar181 = vshufpd_avx(auVar256,auVar256,3);
            auVar144 = vshufpd_avx(auVar262,auVar262,3);
            auVar98 = vsubps_avx(auVar181,auVar256);
            auVar204 = vsubps_avx(auVar144,auVar262);
            auVar96._0_4_ = auVar98._0_4_ + auVar204._0_4_;
            auVar96._4_4_ = auVar98._4_4_ + auVar204._4_4_;
            auVar96._8_4_ = auVar98._8_4_ + auVar204._8_4_;
            auVar96._12_4_ = auVar98._12_4_ + auVar204._12_4_;
            auVar98 = vmovshdup_avx(auVar256);
            auVar204 = vmovshdup_avx(auVar216);
            auVar167 = vshufps_avx(auVar96,auVar96,0);
            auVar133 = vshufps_avx(auVar96,auVar96,0x55);
            fVar227 = auVar133._0_4_;
            fVar229 = auVar133._4_4_;
            fVar231 = auVar133._8_4_;
            fVar233 = auVar133._12_4_;
            fVar250 = auVar167._0_4_;
            fVar251 = auVar167._4_4_;
            fVar252 = auVar167._8_4_;
            fVar117 = auVar167._12_4_;
            auVar97._0_4_ = fVar250 * auVar256._0_4_ + auVar98._0_4_ * fVar227;
            auVar97._4_4_ = fVar251 * auVar256._4_4_ + auVar98._4_4_ * fVar229;
            auVar97._8_4_ = fVar252 * auVar256._8_4_ + auVar98._8_4_ * fVar231;
            auVar97._12_4_ = fVar117 * auVar256._12_4_ + auVar98._12_4_ * fVar233;
            auVar315._0_4_ = fVar250 * auVar216._0_4_ + auVar204._0_4_ * fVar227;
            auVar315._4_4_ = fVar251 * auVar216._4_4_ + auVar204._4_4_ * fVar229;
            auVar315._8_4_ = fVar252 * auVar216._8_4_ + auVar204._8_4_ * fVar231;
            auVar315._12_4_ = fVar117 * auVar216._12_4_ + auVar204._12_4_ * fVar233;
            auVar204 = vshufps_avx(auVar97,auVar97,0xe8);
            auVar167 = vshufps_avx(auVar315,auVar315,0xe8);
            auVar98 = vcmpps_avx(auVar204,auVar167,1);
            uVar70 = vextractps_avx(auVar98,0);
            auVar133 = auVar315;
            if ((uVar70 & 1) == 0) {
              auVar133 = auVar97;
            }
            auVar131._0_4_ = auVar132._0_4_ * auVar111._16_4_ * 3.0;
            auVar131._4_4_ = auVar132._4_4_ * auVar111._20_4_ * 3.0;
            auVar131._8_4_ = auVar132._8_4_ * auVar111._24_4_ * 3.0;
            auVar131._12_4_ = auVar132._12_4_ * 0.0;
            auVar271 = vsubps_avx(auVar262,auVar131);
            auVar132 = vmovshdup_avx(auVar271);
            auVar262 = vmovshdup_avx(auVar262);
            fVar118 = auVar271._0_4_;
            fVar119 = auVar271._4_4_;
            auVar243._0_4_ = fVar118 * fVar250 + auVar132._0_4_ * fVar227;
            auVar243._4_4_ = fVar119 * fVar251 + auVar132._4_4_ * fVar229;
            auVar243._8_4_ = auVar271._8_4_ * fVar252 + auVar132._8_4_ * fVar231;
            auVar243._12_4_ = auVar271._12_4_ * fVar117 + auVar132._12_4_ * fVar233;
            auVar364._0_4_ = fVar250 * auVar261._16_4_ + auVar262._0_4_ * fVar227;
            auVar364._4_4_ = fVar251 * auVar261._20_4_ + auVar262._4_4_ * fVar229;
            auVar364._8_4_ = fVar252 * auVar261._24_4_ + auVar262._8_4_ * fVar231;
            auVar364._12_4_ = fVar117 * auVar261._28_4_ + auVar262._12_4_ * fVar233;
            auVar262 = vshufps_avx(auVar243,auVar243,0xe8);
            auVar263 = vshufps_avx(auVar364,auVar364,0xe8);
            auVar132 = vcmpps_avx(auVar262,auVar263,1);
            uVar70 = vextractps_avx(auVar132,0);
            auVar272 = auVar364;
            if ((uVar70 & 1) == 0) {
              auVar272 = auVar243;
            }
            auVar133 = vmaxss_avx(auVar272,auVar133);
            auVar204 = vminps_avx(auVar204,auVar167);
            auVar167 = vminps_avx(auVar262,auVar263);
            auVar167 = vminps_avx(auVar204,auVar167);
            auVar98 = vshufps_avx(auVar98,auVar98,0x55);
            auVar98 = vblendps_avx(auVar98,auVar132,2);
            auVar132 = vpslld_avx(auVar98,0x1f);
            auVar98 = vshufpd_avx(auVar315,auVar315,1);
            auVar98 = vinsertps_avx(auVar98,auVar364,0x9c);
            auVar204 = vshufpd_avx(auVar97,auVar97,1);
            auVar204 = vinsertps_avx(auVar204,auVar243,0x9c);
            auVar98 = vblendvps_avx(auVar204,auVar98,auVar132);
            auVar204 = vmovshdup_avx(auVar98);
            auVar98 = vmaxss_avx(auVar204,auVar98);
            fVar231 = auVar167._0_4_;
            auVar204 = vmovshdup_avx(auVar167);
            fVar229 = auVar98._0_4_;
            fVar233 = auVar204._0_4_;
            fVar227 = auVar133._0_4_;
            if ((fVar231 < 0.0001) && (-0.0001 < fVar229)) break;
            if ((fVar233 < 0.0001 && -0.0001 < fVar227) || (fVar231 < 0.0001 && -0.0001 < fVar227))
            break;
            auVar132 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar98,1);
            auVar204 = vcmpps_avx(auVar204,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar204 = vandps_avx(auVar204,auVar132);
          } while ((auVar204 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar132 = vcmpps_avx(auVar167,_DAT_01f45a50,1);
          auVar204 = vcmpss_avx(auVar133,ZEXT416(0) << 0x20,1);
          auVar166._8_4_ = 0x3f800000;
          auVar166._0_8_ = 0x3f8000003f800000;
          auVar166._12_4_ = 0x3f800000;
          auVar217._8_4_ = 0xbf800000;
          auVar217._0_8_ = 0xbf800000bf800000;
          auVar217._12_4_ = 0xbf800000;
          auVar204 = vblendvps_avx(auVar166,auVar217,auVar204);
          auVar132 = vblendvps_avx(auVar166,auVar217,auVar132);
          auVar167 = vcmpss_avx(auVar132,auVar204,4);
          auVar167 = vpshufd_avx(ZEXT416(auVar167._0_4_ & 1),0x50);
          auVar167 = vpslld_avx(auVar167,0x1f);
          auVar167 = vpsrad_avx(auVar167,0x1f);
          auVar167 = vpandn_avx(auVar167,_DAT_01f7afb0);
          auVar133 = vmovshdup_avx(auVar132);
          fVar250 = auVar133._0_4_;
          if ((auVar132._0_4_ != fVar250) || (NAN(auVar132._0_4_) || NAN(fVar250))) {
            if ((fVar233 != fVar231) || (NAN(fVar233) || NAN(fVar231))) {
              fVar231 = -fVar231 / (fVar233 - fVar231);
              auVar132 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar231) * 0.0 + fVar231)));
            }
            else {
              auVar132 = ZEXT816(0x3f80000000000000);
              if ((fVar231 != 0.0) || (NAN(fVar231))) {
                auVar132 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar262 = vcmpps_avx(auVar167,auVar132,1);
            auVar133 = vblendps_avx(auVar167,auVar132,2);
            auVar132 = vblendps_avx(auVar132,auVar167,2);
            auVar167 = vblendvps_avx(auVar132,auVar133,auVar262);
          }
          auVar98 = vcmpss_avx(auVar98,ZEXT416(0) << 0x20,1);
          auVar168._8_4_ = 0x3f800000;
          auVar168._0_8_ = 0x3f8000003f800000;
          auVar168._12_4_ = 0x3f800000;
          auVar218._8_4_ = 0xbf800000;
          auVar218._0_8_ = 0xbf800000bf800000;
          auVar218._12_4_ = 0xbf800000;
          auVar98 = vblendvps_avx(auVar168,auVar218,auVar98);
          fVar231 = auVar98._0_4_;
          if ((auVar204._0_4_ != fVar231) || (NAN(auVar204._0_4_) || NAN(fVar231))) {
            if ((fVar229 != fVar227) || (NAN(fVar229) || NAN(fVar227))) {
              fVar227 = -fVar227 / (fVar229 - fVar227);
              auVar98 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar227) * 0.0 + fVar227)));
            }
            else {
              auVar98 = ZEXT816(0x3f80000000000000);
              if ((fVar227 != 0.0) || (NAN(fVar227))) {
                auVar98 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar132 = vcmpps_avx(auVar167,auVar98,1);
            auVar204 = vblendps_avx(auVar167,auVar98,2);
            auVar98 = vblendps_avx(auVar98,auVar167,2);
            auVar167 = vblendvps_avx(auVar98,auVar204,auVar132);
          }
          if ((fVar250 != fVar231) || (NAN(fVar250) || NAN(fVar231))) {
            auVar99._8_4_ = 0x3f800000;
            auVar99._0_8_ = 0x3f8000003f800000;
            auVar99._12_4_ = 0x3f800000;
            auVar98 = vcmpps_avx(auVar167,auVar99,1);
            auVar204 = vinsertps_avx(auVar167,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar169._4_12_ = auVar167._4_12_;
            auVar169._0_4_ = 0x3f800000;
            auVar167 = vblendvps_avx(auVar169,auVar204,auVar98);
          }
          auVar98 = vcmpps_avx(auVar167,_DAT_01f46740,1);
          auVar65._12_4_ = 0;
          auVar65._0_12_ = auVar167._4_12_;
          auVar204 = vinsertps_avx(auVar167,ZEXT416(0x3f800000),0x10);
          auVar98 = vblendvps_avx(auVar204,auVar65 << 0x20,auVar98);
          auVar204 = vmovshdup_avx(auVar98);
        } while (auVar204._0_4_ < auVar98._0_4_);
        auVar100._0_4_ = auVar98._0_4_ + -0.1;
        auVar100._4_4_ = auVar98._4_4_ + 0.1;
        auVar100._8_4_ = auVar98._8_4_ + 0.0;
        auVar100._12_4_ = auVar98._12_4_ + 0.0;
        auVar132 = vshufpd_avx(auVar216,auVar216,3);
        auVar257._8_8_ = 0x3f80000000000000;
        auVar257._0_8_ = 0x3f80000000000000;
        auVar98 = vcmpps_avx(auVar100,auVar257,1);
        auVar63._12_4_ = 0;
        auVar63._0_12_ = auVar100._4_12_;
        auVar204 = vinsertps_avx(auVar100,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar98 = vblendvps_avx(auVar204,auVar63 << 0x20,auVar98);
        auVar204 = vshufpd_avx(auVar271,auVar271,3);
        auVar167 = vshufps_avx(auVar98,auVar98,0x50);
        auVar258._8_4_ = 0x3f800000;
        auVar258._0_8_ = 0x3f8000003f800000;
        auVar258._12_4_ = 0x3f800000;
        auVar133 = vsubps_avx(auVar258,auVar167);
        local_488 = auVar181._0_4_;
        fStack_484 = auVar181._4_4_;
        fStack_480 = auVar181._8_4_;
        fStack_47c = auVar181._12_4_;
        fVar227 = auVar167._0_4_;
        fVar229 = auVar167._4_4_;
        fVar231 = auVar167._8_4_;
        fVar233 = auVar167._12_4_;
        local_5b8 = auVar144._0_4_;
        fStack_5b4 = auVar144._4_4_;
        fStack_5b0 = auVar144._8_4_;
        fStack_5ac = auVar144._12_4_;
        fVar250 = auVar133._0_4_;
        fVar251 = auVar133._4_4_;
        fVar252 = auVar133._8_4_;
        fVar117 = auVar133._12_4_;
        auVar101._0_4_ = fVar227 * local_488 + fVar250 * auVar256._0_4_;
        auVar101._4_4_ = fVar229 * fStack_484 + fVar251 * auVar256._4_4_;
        auVar101._8_4_ = fVar231 * fStack_480 + fVar252 * auVar256._0_4_;
        auVar101._12_4_ = fVar233 * fStack_47c + fVar117 * auVar256._4_4_;
        auVar244._0_4_ = auVar132._0_4_ * fVar227 + fVar250 * auVar216._0_4_;
        auVar244._4_4_ = auVar132._4_4_ * fVar229 + fVar251 * auVar216._4_4_;
        auVar244._8_4_ = auVar132._8_4_ * fVar231 + fVar252 * auVar216._0_4_;
        auVar244._12_4_ = auVar132._12_4_ * fVar233 + fVar117 * auVar216._4_4_;
        auVar268._0_4_ = auVar204._0_4_ * fVar227 + fVar250 * fVar118;
        auVar268._4_4_ = auVar204._4_4_ * fVar229 + fVar251 * fVar119;
        auVar268._8_4_ = auVar204._8_4_ * fVar231 + fVar252 * fVar118;
        auVar268._12_4_ = auVar204._12_4_ * fVar233 + fVar117 * fVar119;
        auVar307._0_4_ = fVar227 * local_5b8 + fVar250 * auVar261._16_4_;
        auVar307._4_4_ = fVar229 * fStack_5b4 + fVar251 * auVar261._20_4_;
        auVar307._8_4_ = fVar231 * fStack_5b0 + fVar252 * auVar261._16_4_;
        auVar307._12_4_ = fVar233 * fStack_5ac + fVar117 * auVar261._20_4_;
        auVar144 = vsubps_avx(auVar258,auVar98);
        auVar204 = vmovshdup_avx(auVar314);
        auVar181 = vmovsldup_avx(auVar314);
        auVar259._0_4_ = auVar144._0_4_ * auVar181._0_4_ + auVar98._0_4_ * auVar204._0_4_;
        auVar259._4_4_ = auVar144._4_4_ * auVar181._4_4_ + auVar98._4_4_ * auVar204._4_4_;
        auVar259._8_4_ = auVar144._8_4_ * auVar181._8_4_ + auVar98._8_4_ * auVar204._8_4_;
        auVar259._12_4_ = auVar144._12_4_ * auVar181._12_4_ + auVar98._12_4_ * auVar204._12_4_;
        auVar271 = vmovshdup_avx(auVar259);
        auVar98 = vsubps_avx(auVar244,auVar101);
        auVar170._0_4_ = auVar98._0_4_ * 3.0;
        auVar170._4_4_ = auVar98._4_4_ * 3.0;
        auVar170._8_4_ = auVar98._8_4_ * 3.0;
        auVar170._12_4_ = auVar98._12_4_ * 3.0;
        auVar98 = vsubps_avx(auVar268,auVar244);
        auVar194._0_4_ = auVar98._0_4_ * 3.0;
        auVar194._4_4_ = auVar98._4_4_ * 3.0;
        auVar194._8_4_ = auVar98._8_4_ * 3.0;
        auVar194._12_4_ = auVar98._12_4_ * 3.0;
        auVar98 = vsubps_avx(auVar307,auVar268);
        auVar283._0_4_ = auVar98._0_4_ * 3.0;
        auVar283._4_4_ = auVar98._4_4_ * 3.0;
        auVar283._8_4_ = auVar98._8_4_ * 3.0;
        auVar283._12_4_ = auVar98._12_4_ * 3.0;
        auVar204 = vminps_avx(auVar194,auVar283);
        auVar98 = vmaxps_avx(auVar194,auVar283);
        auVar204 = vminps_avx(auVar170,auVar204);
        auVar98 = vmaxps_avx(auVar170,auVar98);
        auVar181 = vshufpd_avx(auVar204,auVar204,3);
        auVar144 = vshufpd_avx(auVar98,auVar98,3);
        auVar204 = vminps_avx(auVar204,auVar181);
        auVar98 = vmaxps_avx(auVar98,auVar144);
        auVar181 = vshufps_avx(ZEXT416((uint)(1.0 / fVar200)),ZEXT416((uint)(1.0 / fVar200)),0);
        auVar284._0_4_ = auVar181._0_4_ * auVar204._0_4_;
        auVar284._4_4_ = auVar181._4_4_ * auVar204._4_4_;
        auVar284._8_4_ = auVar181._8_4_ * auVar204._8_4_;
        auVar284._12_4_ = auVar181._12_4_ * auVar204._12_4_;
        auVar293._0_4_ = auVar181._0_4_ * auVar98._0_4_;
        auVar293._4_4_ = auVar181._4_4_ * auVar98._4_4_;
        auVar293._8_4_ = auVar181._8_4_ * auVar98._8_4_;
        auVar293._12_4_ = auVar181._12_4_ * auVar98._12_4_;
        auVar133 = ZEXT416((uint)(1.0 / (auVar271._0_4_ - auVar259._0_4_)));
        auVar98 = vshufpd_avx(auVar101,auVar101,3);
        auVar204 = vshufpd_avx(auVar244,auVar244,3);
        auVar181 = vshufpd_avx(auVar268,auVar268,3);
        auVar144 = vshufpd_avx(auVar307,auVar307,3);
        auVar98 = vsubps_avx(auVar98,auVar101);
        auVar132 = vsubps_avx(auVar204,auVar244);
        auVar167 = vsubps_avx(auVar181,auVar268);
        auVar144 = vsubps_avx(auVar144,auVar307);
        auVar204 = vminps_avx(auVar98,auVar132);
        auVar98 = vmaxps_avx(auVar98,auVar132);
        auVar181 = vminps_avx(auVar167,auVar144);
        auVar181 = vminps_avx(auVar204,auVar181);
        auVar204 = vmaxps_avx(auVar167,auVar144);
        auVar98 = vmaxps_avx(auVar98,auVar204);
        auVar204 = vshufps_avx(auVar133,auVar133,0);
        auVar345._0_4_ = auVar204._0_4_ * auVar181._0_4_;
        auVar345._4_4_ = auVar204._4_4_ * auVar181._4_4_;
        auVar345._8_4_ = auVar204._8_4_ * auVar181._8_4_;
        auVar345._12_4_ = auVar204._12_4_ * auVar181._12_4_;
        auVar357._0_4_ = auVar204._0_4_ * auVar98._0_4_;
        auVar357._4_4_ = auVar204._4_4_ * auVar98._4_4_;
        auVar357._8_4_ = auVar204._8_4_ * auVar98._8_4_;
        auVar357._12_4_ = auVar204._12_4_ * auVar98._12_4_;
        auVar98 = vmovsldup_avx(auVar259);
        auVar308._4_12_ = auVar98._4_12_;
        auVar308._0_4_ = fVar202;
        auVar316._4_12_ = auVar259._4_12_;
        auVar316._0_4_ = fVar199;
        auVar195._0_4_ = (fVar202 + fVar199) * 0.5;
        auVar195._4_4_ = (auVar98._4_4_ + auVar259._4_4_) * 0.5;
        auVar195._8_4_ = (auVar98._8_4_ + auVar259._8_4_) * 0.5;
        auVar195._12_4_ = (auVar98._12_4_ + auVar259._12_4_) * 0.5;
        auVar98 = vshufps_avx(auVar195,auVar195,0);
        local_258 = auVar23._0_4_;
        fStack_254 = auVar23._4_4_;
        fStack_250 = auVar23._8_4_;
        fStack_24c = auVar23._12_4_;
        fVar227 = auVar98._0_4_;
        fVar229 = auVar98._4_4_;
        fVar231 = auVar98._8_4_;
        fVar233 = auVar98._12_4_;
        p00.field_0.i[0] = auVar24._0_4_;
        p00.field_0.i[1] = auVar24._4_4_;
        p00.field_0.i[2] = auVar24._8_4_;
        p00.field_0.i[3] = auVar24._12_4_;
        auVar134._0_4_ = fVar227 * local_258 + p00.field_0.v[0];
        auVar134._4_4_ = fVar229 * fStack_254 + p00.field_0.v[1];
        auVar134._8_4_ = fVar231 * fStack_250 + p00.field_0.v[2];
        auVar134._12_4_ = fVar233 * fStack_24c + p00.field_0.v[3];
        local_268 = auVar121._0_4_;
        fStack_264 = auVar121._4_4_;
        fStack_260 = auVar121._8_4_;
        fStack_25c = auVar121._12_4_;
        p01.field_0.i[0] = auVar160._0_4_;
        p01.field_0.i[1] = auVar160._4_4_;
        p01.field_0.i[2] = auVar160._8_4_;
        p01.field_0.i[3] = auVar160._12_4_;
        auVar171._0_4_ = fVar227 * local_268 + p01.field_0.v[0];
        auVar171._4_4_ = fVar229 * fStack_264 + p01.field_0.v[1];
        auVar171._8_4_ = fVar231 * fStack_260 + p01.field_0.v[2];
        auVar171._12_4_ = fVar233 * fStack_25c + p01.field_0.v[3];
        local_278 = auVar120._0_4_;
        fStack_274 = auVar120._4_4_;
        fStack_270 = auVar120._8_4_;
        fStack_26c = auVar120._12_4_;
        p02.field_0.i[0] = auVar19._0_4_;
        p02.field_0.i[1] = auVar19._4_4_;
        p02.field_0.i[2] = auVar19._8_4_;
        p02.field_0.i[3] = auVar19._12_4_;
        auVar245._0_4_ = fVar227 * local_278 + p02.field_0.v[0];
        auVar245._4_4_ = fVar229 * fStack_274 + p02.field_0.v[1];
        auVar245._8_4_ = fVar231 * fStack_270 + p02.field_0.v[2];
        auVar245._12_4_ = fVar233 * fStack_26c + p02.field_0.v[3];
        auVar98 = vsubps_avx(auVar171,auVar134);
        auVar135._0_4_ = auVar134._0_4_ + fVar227 * auVar98._0_4_;
        auVar135._4_4_ = auVar134._4_4_ + fVar229 * auVar98._4_4_;
        auVar135._8_4_ = auVar134._8_4_ + fVar231 * auVar98._8_4_;
        auVar135._12_4_ = auVar134._12_4_ + fVar233 * auVar98._12_4_;
        auVar98 = vsubps_avx(auVar245,auVar171);
        auVar172._0_4_ = auVar171._0_4_ + fVar227 * auVar98._0_4_;
        auVar172._4_4_ = auVar171._4_4_ + fVar229 * auVar98._4_4_;
        auVar172._8_4_ = auVar171._8_4_ + fVar231 * auVar98._8_4_;
        auVar172._12_4_ = auVar171._12_4_ + fVar233 * auVar98._12_4_;
        auVar98 = vsubps_avx(auVar172,auVar135);
        fVar227 = auVar135._0_4_ + fVar227 * auVar98._0_4_;
        fVar229 = auVar135._4_4_ + fVar229 * auVar98._4_4_;
        auVar102._0_8_ = CONCAT44(fVar229,fVar227);
        auVar102._8_4_ = auVar135._8_4_ + fVar231 * auVar98._8_4_;
        auVar102._12_4_ = auVar135._12_4_ + fVar233 * auVar98._12_4_;
        fVar231 = auVar98._0_4_ * 3.0;
        fVar233 = auVar98._4_4_ * 3.0;
        auVar136._0_8_ = CONCAT44(fVar233,fVar231);
        auVar136._8_4_ = auVar98._8_4_ * 3.0;
        auVar136._12_4_ = auVar98._12_4_ * 3.0;
        auVar173._8_8_ = auVar102._0_8_;
        auVar173._0_8_ = auVar102._0_8_;
        auVar98 = vshufpd_avx(auVar102,auVar102,3);
        auVar204 = vshufps_avx(auVar195,auVar195,0x55);
        auVar167 = vsubps_avx(auVar98,auVar173);
        auVar331._0_4_ = auVar167._0_4_ * auVar204._0_4_ + fVar227;
        auVar331._4_4_ = auVar167._4_4_ * auVar204._4_4_ + fVar229;
        auVar331._8_4_ = auVar167._8_4_ * auVar204._8_4_ + fVar227;
        auVar331._12_4_ = auVar167._12_4_ * auVar204._12_4_ + fVar229;
        auVar174._8_8_ = auVar136._0_8_;
        auVar174._0_8_ = auVar136._0_8_;
        auVar98 = vshufpd_avx(auVar136,auVar136,1);
        auVar98 = vsubps_avx(auVar98,auVar174);
        auVar137._0_4_ = auVar98._0_4_ * auVar204._0_4_ + fVar231;
        auVar137._4_4_ = auVar98._4_4_ * auVar204._4_4_ + fVar233;
        auVar137._8_4_ = auVar98._8_4_ * auVar204._8_4_ + fVar231;
        auVar137._12_4_ = auVar98._12_4_ * auVar204._12_4_ + fVar233;
        auVar204 = vmovshdup_avx(auVar137);
        auVar246._0_8_ = auVar204._0_8_ ^ 0x8000000080000000;
        auVar246._8_4_ = auVar204._8_4_ ^ 0x80000000;
        auVar246._12_4_ = auVar204._12_4_ ^ 0x80000000;
        auVar181 = vmovshdup_avx(auVar167);
        auVar98 = vunpcklps_avx(auVar181,auVar246);
        auVar144 = vshufps_avx(auVar98,auVar246,4);
        auVar103._0_8_ = auVar167._0_8_ ^ 0x8000000080000000;
        auVar103._8_4_ = -auVar167._8_4_;
        auVar103._12_4_ = -auVar167._12_4_;
        auVar98 = vmovlhps_avx(auVar103,auVar137);
        auVar132 = vshufps_avx(auVar98,auVar137,8);
        auVar98 = ZEXT416((uint)(auVar137._0_4_ * auVar181._0_4_ - auVar167._0_4_ * auVar204._0_4_))
        ;
        auVar204 = vshufps_avx(auVar98,auVar98,0);
        auVar98 = vdivps_avx(auVar144,auVar204);
        auVar204 = vdivps_avx(auVar132,auVar204);
        auVar132 = vinsertps_avx(auVar284,auVar345,0x1c);
        auVar167 = vinsertps_avx(auVar293,auVar357,0x1c);
        auVar133 = vinsertps_avx(auVar345,auVar284,0x4c);
        auVar262 = vinsertps_avx(auVar357,auVar293,0x4c);
        auVar181 = vmovsldup_avx(auVar98);
        auVar175._0_4_ = auVar181._0_4_ * auVar132._0_4_;
        auVar175._4_4_ = auVar181._4_4_ * auVar132._4_4_;
        auVar175._8_4_ = auVar181._8_4_ * auVar132._8_4_;
        auVar175._12_4_ = auVar181._12_4_ * auVar132._12_4_;
        auVar138._0_4_ = auVar167._0_4_ * auVar181._0_4_;
        auVar138._4_4_ = auVar167._4_4_ * auVar181._4_4_;
        auVar138._8_4_ = auVar167._8_4_ * auVar181._8_4_;
        auVar138._12_4_ = auVar167._12_4_ * auVar181._12_4_;
        auVar144 = vminps_avx(auVar175,auVar138);
        auVar181 = vmaxps_avx(auVar138,auVar175);
        auVar263 = vmovsldup_avx(auVar204);
        auVar358._0_4_ = auVar133._0_4_ * auVar263._0_4_;
        auVar358._4_4_ = auVar133._4_4_ * auVar263._4_4_;
        auVar358._8_4_ = auVar133._8_4_ * auVar263._8_4_;
        auVar358._12_4_ = auVar133._12_4_ * auVar263._12_4_;
        auVar176._0_4_ = auVar262._0_4_ * auVar263._0_4_;
        auVar176._4_4_ = auVar262._4_4_ * auVar263._4_4_;
        auVar176._8_4_ = auVar262._8_4_ * auVar263._8_4_;
        auVar176._12_4_ = auVar262._12_4_ * auVar263._12_4_;
        auVar263 = vminps_avx(auVar358,auVar176);
        auVar219._0_4_ = auVar144._0_4_ + auVar263._0_4_;
        auVar219._4_4_ = auVar144._4_4_ + auVar263._4_4_;
        auVar219._8_4_ = auVar144._8_4_ + auVar263._8_4_;
        auVar219._12_4_ = auVar144._12_4_ + auVar263._12_4_;
        auVar144 = vmaxps_avx(auVar176,auVar358);
        auVar263 = vsubps_avx(auVar308,auVar195);
        auVar272 = vsubps_avx(auVar316,auVar195);
        auVar139._0_4_ = auVar181._0_4_ + auVar144._0_4_;
        auVar139._4_4_ = auVar181._4_4_ + auVar144._4_4_;
        auVar139._8_4_ = auVar181._8_4_ + auVar144._8_4_;
        auVar139._12_4_ = auVar181._12_4_ + auVar144._12_4_;
        auVar177._8_8_ = 0x3f800000;
        auVar177._0_8_ = 0x3f800000;
        auVar181 = vsubps_avx(auVar177,auVar139);
        auVar144 = vsubps_avx(auVar177,auVar219);
        fVar252 = auVar263._0_4_;
        auVar220._0_4_ = fVar252 * auVar181._0_4_;
        fVar117 = auVar263._4_4_;
        auVar220._4_4_ = fVar117 * auVar181._4_4_;
        fVar118 = auVar263._8_4_;
        auVar220._8_4_ = fVar118 * auVar181._8_4_;
        fVar119 = auVar263._12_4_;
        auVar220._12_4_ = fVar119 * auVar181._12_4_;
        fVar231 = auVar272._0_4_;
        auVar140._0_4_ = fVar231 * auVar181._0_4_;
        fVar233 = auVar272._4_4_;
        auVar140._4_4_ = fVar233 * auVar181._4_4_;
        fVar250 = auVar272._8_4_;
        auVar140._8_4_ = fVar250 * auVar181._8_4_;
        fVar251 = auVar272._12_4_;
        auVar140._12_4_ = fVar251 * auVar181._12_4_;
        auVar317._0_4_ = fVar252 * auVar144._0_4_;
        auVar317._4_4_ = fVar117 * auVar144._4_4_;
        auVar317._8_4_ = fVar118 * auVar144._8_4_;
        auVar317._12_4_ = fVar119 * auVar144._12_4_;
        auVar178._0_4_ = fVar231 * auVar144._0_4_;
        auVar178._4_4_ = fVar233 * auVar144._4_4_;
        auVar178._8_4_ = fVar250 * auVar144._8_4_;
        auVar178._12_4_ = fVar251 * auVar144._12_4_;
        auVar181 = vminps_avx(auVar220,auVar317);
        auVar144 = vminps_avx(auVar140,auVar178);
        auVar263 = vminps_avx(auVar181,auVar144);
        auVar181 = vmaxps_avx(auVar317,auVar220);
        auVar144 = vmaxps_avx(auVar178,auVar140);
        auVar272 = vshufps_avx(auVar195,auVar195,0x54);
        auVar144 = vmaxps_avx(auVar144,auVar181);
        auVar289 = vshufps_avx(auVar331,auVar331,0);
        auVar290 = vshufps_avx(auVar331,auVar331,0x55);
        auVar181 = vhaddps_avx(auVar263,auVar263);
        auVar144 = vhaddps_avx(auVar144,auVar144);
        auVar196._0_4_ = auVar289._0_4_ * auVar98._0_4_ + auVar290._0_4_ * auVar204._0_4_;
        auVar196._4_4_ = auVar289._4_4_ * auVar98._4_4_ + auVar290._4_4_ * auVar204._4_4_;
        auVar196._8_4_ = auVar289._8_4_ * auVar98._8_4_ + auVar290._8_4_ * auVar204._8_4_;
        auVar196._12_4_ = auVar289._12_4_ * auVar98._12_4_ + auVar290._12_4_ * auVar204._12_4_;
        auVar263 = vsubps_avx(auVar272,auVar196);
        fVar227 = auVar263._0_4_ + auVar181._0_4_;
        fVar229 = auVar263._0_4_ + auVar144._0_4_;
        auVar181 = vmaxss_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar227));
        auVar144 = vminss_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar199));
      } while (auVar144._0_4_ < auVar181._0_4_);
      auVar181 = vmovshdup_avx(auVar98);
      auVar104._0_4_ = auVar181._0_4_ * auVar132._0_4_;
      auVar104._4_4_ = auVar181._4_4_ * auVar132._4_4_;
      auVar104._8_4_ = auVar181._8_4_ * auVar132._8_4_;
      auVar104._12_4_ = auVar181._12_4_ * auVar132._12_4_;
      auVar141._0_4_ = auVar167._0_4_ * auVar181._0_4_;
      auVar141._4_4_ = auVar167._4_4_ * auVar181._4_4_;
      auVar141._8_4_ = auVar167._8_4_ * auVar181._8_4_;
      auVar141._12_4_ = auVar167._12_4_ * auVar181._12_4_;
      auVar144 = vminps_avx(auVar104,auVar141);
      auVar181 = vmaxps_avx(auVar141,auVar104);
      auVar132 = vmovshdup_avx(auVar204);
      auVar221._0_4_ = auVar133._0_4_ * auVar132._0_4_;
      auVar221._4_4_ = auVar133._4_4_ * auVar132._4_4_;
      auVar221._8_4_ = auVar133._8_4_ * auVar132._8_4_;
      auVar221._12_4_ = auVar133._12_4_ * auVar132._12_4_;
      auVar142._0_4_ = auVar262._0_4_ * auVar132._0_4_;
      auVar142._4_4_ = auVar262._4_4_ * auVar132._4_4_;
      auVar142._8_4_ = auVar262._8_4_ * auVar132._8_4_;
      auVar142._12_4_ = auVar262._12_4_ * auVar132._12_4_;
      auVar132 = vminps_avx(auVar221,auVar142);
      auVar179._0_4_ = auVar144._0_4_ + auVar132._0_4_;
      auVar179._4_4_ = auVar144._4_4_ + auVar132._4_4_;
      auVar179._8_4_ = auVar144._8_4_ + auVar132._8_4_;
      auVar179._12_4_ = auVar144._12_4_ + auVar132._12_4_;
      auVar144 = vmaxps_avx(auVar142,auVar221);
      auVar105._0_4_ = auVar181._0_4_ + auVar144._0_4_;
      auVar105._4_4_ = auVar181._4_4_ + auVar144._4_4_;
      auVar105._8_4_ = auVar181._8_4_ + auVar144._8_4_;
      auVar105._12_4_ = auVar181._12_4_ + auVar144._12_4_;
      auVar181 = vsubps_avx(auVar257,auVar105);
      auVar144 = vsubps_avx(auVar257,auVar179);
      auVar180._0_4_ = fVar252 * auVar181._0_4_;
      auVar180._4_4_ = fVar117 * auVar181._4_4_;
      auVar180._8_4_ = fVar118 * auVar181._8_4_;
      auVar180._12_4_ = fVar119 * auVar181._12_4_;
      auVar222._0_4_ = fVar252 * auVar144._0_4_;
      auVar222._4_4_ = fVar117 * auVar144._4_4_;
      auVar222._8_4_ = fVar118 * auVar144._8_4_;
      auVar222._12_4_ = fVar119 * auVar144._12_4_;
      auVar106._0_4_ = fVar231 * auVar181._0_4_;
      auVar106._4_4_ = fVar233 * auVar181._4_4_;
      auVar106._8_4_ = fVar250 * auVar181._8_4_;
      auVar106._12_4_ = fVar251 * auVar181._12_4_;
      auVar143._0_4_ = fVar231 * auVar144._0_4_;
      auVar143._4_4_ = fVar233 * auVar144._4_4_;
      auVar143._8_4_ = fVar250 * auVar144._8_4_;
      auVar143._12_4_ = fVar251 * auVar144._12_4_;
      auVar181 = vminps_avx(auVar180,auVar222);
      auVar144 = vminps_avx(auVar106,auVar143);
      auVar181 = vminps_avx(auVar181,auVar144);
      auVar144 = vmaxps_avx(auVar222,auVar180);
      auVar132 = vmaxps_avx(auVar143,auVar106);
      auVar181 = vhaddps_avx(auVar181,auVar181);
      auVar144 = vmaxps_avx(auVar132,auVar144);
      auVar144 = vhaddps_avx(auVar144,auVar144);
      auVar132 = vmovshdup_avx(auVar263);
      auVar167 = ZEXT416((uint)(auVar132._0_4_ + auVar181._0_4_));
      auVar181 = vmaxss_avx(auVar259,auVar167);
      auVar132 = ZEXT416((uint)(auVar132._0_4_ + auVar144._0_4_));
      auVar144 = vminss_avx(auVar132,auVar271);
    } while (auVar144._0_4_ < auVar181._0_4_);
    bVar75 = 0;
    if ((fVar202 < fVar227) && (fVar229 < fVar199)) {
      auVar181 = vcmpps_avx(auVar132,auVar271,1);
      auVar144 = vcmpps_avx(auVar259,auVar167,1);
      auVar181 = vandps_avx(auVar144,auVar181);
      bVar75 = auVar181[0];
    }
    auVar285._8_4_ = 0x7fffffff;
    auVar285._0_8_ = 0x7fffffff7fffffff;
    auVar285._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar25._0_4_;
    p03.field_0.i[1] = auVar25._4_4_;
    p03.field_0.i[2] = auVar25._8_4_;
    p03.field_0.i[3] = auVar25._12_4_;
    if ((3 < (uint)uVar72 || fVar200 < 0.001) || (bVar75 & 1) != 0) {
      lVar74 = 0xc9;
      do {
        lVar74 = lVar74 + -1;
        if (lVar74 == 0) goto LAB_008b8d66;
        fVar200 = auVar263._0_4_;
        fVar199 = 1.0 - fVar200;
        auVar181 = ZEXT416((uint)(fVar199 * fVar199 * fVar199));
        auVar181 = vshufps_avx(auVar181,auVar181,0);
        auVar144 = ZEXT416((uint)(fVar200 * 3.0 * fVar199 * fVar199));
        auVar144 = vshufps_avx(auVar144,auVar144,0);
        auVar132 = ZEXT416((uint)(fVar199 * fVar200 * fVar200 * 3.0));
        auVar132 = vshufps_avx(auVar132,auVar132,0);
        auVar167 = ZEXT416((uint)(fVar200 * fVar200 * fVar200));
        auVar167 = vshufps_avx(auVar167,auVar167,0);
        fVar199 = p00.field_0.v[0] * auVar181._0_4_ +
                  p01.field_0.v[0] * auVar144._0_4_ +
                  p03.field_0.v[0] * auVar167._0_4_ + p02.field_0.v[0] * auVar132._0_4_;
        fVar200 = p00.field_0.v[1] * auVar181._4_4_ +
                  p01.field_0.v[1] * auVar144._4_4_ +
                  p03.field_0.v[1] * auVar167._4_4_ + p02.field_0.v[1] * auVar132._4_4_;
        auVar107._0_8_ = CONCAT44(fVar200,fVar199);
        auVar107._8_4_ =
             p00.field_0.v[2] * auVar181._8_4_ +
             p01.field_0.v[2] * auVar144._8_4_ +
             p03.field_0.v[2] * auVar167._8_4_ + p02.field_0.v[2] * auVar132._8_4_;
        auVar107._12_4_ =
             p00.field_0.v[3] * auVar181._12_4_ +
             p01.field_0.v[3] * auVar144._12_4_ +
             p03.field_0.v[3] * auVar167._12_4_ + p02.field_0.v[3] * auVar132._12_4_;
        auVar145._8_8_ = auVar107._0_8_;
        auVar145._0_8_ = auVar107._0_8_;
        auVar144 = vshufpd_avx(auVar107,auVar107,1);
        auVar181 = vmovshdup_avx(auVar263);
        auVar144 = vsubps_avx(auVar144,auVar145);
        auVar108._0_4_ = auVar181._0_4_ * auVar144._0_4_ + fVar199;
        auVar108._4_4_ = auVar181._4_4_ * auVar144._4_4_ + fVar200;
        auVar108._8_4_ = auVar181._8_4_ * auVar144._8_4_ + fVar199;
        auVar108._12_4_ = auVar181._12_4_ * auVar144._12_4_ + fVar200;
        auVar181 = vshufps_avx(auVar108,auVar108,0);
        auVar144 = vshufps_avx(auVar108,auVar108,0x55);
        auVar146._0_4_ = auVar98._0_4_ * auVar181._0_4_ + auVar204._0_4_ * auVar144._0_4_;
        auVar146._4_4_ = auVar98._4_4_ * auVar181._4_4_ + auVar204._4_4_ * auVar144._4_4_;
        auVar146._8_4_ = auVar98._8_4_ * auVar181._8_4_ + auVar204._8_4_ * auVar144._8_4_;
        auVar146._12_4_ = auVar98._12_4_ * auVar181._12_4_ + auVar204._12_4_ * auVar144._12_4_;
        auVar263 = vsubps_avx(auVar263,auVar146);
        auVar181 = vandps_avx(auVar285,auVar108);
        auVar144 = vshufps_avx(auVar181,auVar181,0xf5);
        auVar181 = vmaxss_avx(auVar144,auVar181);
      } while (fVar198 <= auVar181._0_4_);
      fVar199 = auVar263._0_4_;
      if ((0.0 <= fVar199) && (fVar199 <= 1.0)) {
        auVar98 = vmovshdup_avx(auVar263);
        fVar200 = auVar98._0_4_;
        if ((0.0 <= fVar200) && (fVar200 <= 1.0)) {
          auVar98 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                  ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar262 = vinsertps_avx(auVar98,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28)
          ;
          auVar98 = vdpps_avx(auVar262,auVar288,0x7f);
          auVar204 = vdpps_avx(auVar262,auVar26,0x7f);
          auVar181 = vdpps_avx(auVar262,auVar20,0x7f);
          auVar144 = vdpps_avx(auVar262,auVar21,0x7f);
          auVar132 = vdpps_avx(auVar262,auVar22,0x7f);
          auVar167 = vdpps_avx(auVar262,auVar79,0x7f);
          auVar133 = vdpps_avx(auVar262,auVar80,0x7f);
          auVar262 = vdpps_avx(auVar262,auVar81,0x7f);
          fVar233 = 1.0 - fVar200;
          fVar250 = 1.0 - fVar199;
          fVar202 = auVar263._4_4_;
          fVar227 = auVar263._8_4_;
          fVar229 = auVar263._12_4_;
          fVar231 = fVar250 * fVar199 * fVar199 * 3.0;
          auVar269._0_4_ = fVar199 * fVar199 * fVar199;
          auVar269._4_4_ = fVar202 * fVar202 * fVar202;
          auVar269._8_4_ = fVar227 * fVar227 * fVar227;
          auVar269._12_4_ = fVar229 * fVar229 * fVar229;
          fVar227 = fVar250 * fVar250 * fVar199 * 3.0;
          fVar229 = fVar250 * fVar250 * fVar250;
          fVar202 = fVar229 * (fVar233 * auVar98._0_4_ + fVar200 * auVar132._0_4_) +
                    (fVar233 * auVar204._0_4_ + auVar167._0_4_ * fVar200) * fVar227 +
                    fVar231 * (auVar133._0_4_ * fVar200 + fVar233 * auVar181._0_4_) +
                    auVar269._0_4_ * (fVar233 * auVar144._0_4_ + fVar200 * auVar262._0_4_);
          auVar98 = ZEXT416((uint)fVar202);
          if (((fVar184 <= fVar202) &&
              (fVar233 = *(float *)(ray + k * 4 + 0x80), fVar202 <= fVar233)) &&
             (pGVar12 = (context->scene->geometries).items[uVar71].ptr,
             (pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
            local_1e8 = vshufps_avx(auVar263,auVar263,0x55);
            auVar294._8_4_ = 0x3f800000;
            auVar294._0_8_ = 0x3f8000003f800000;
            auVar294._12_4_ = 0x3f800000;
            auVar204 = vsubps_avx(auVar294,local_1e8);
            fVar251 = local_1e8._0_4_;
            fVar252 = local_1e8._4_4_;
            fVar117 = local_1e8._8_4_;
            fVar118 = local_1e8._12_4_;
            fVar119 = auVar204._0_4_;
            fVar311 = auVar204._4_4_;
            fVar321 = auVar204._8_4_;
            fVar323 = auVar204._12_4_;
            auVar309._0_4_ = fVar251 * auVar330._0_4_ + fVar119 * auVar291._0_4_;
            auVar309._4_4_ = fVar252 * auVar330._4_4_ + fVar311 * auVar291._4_4_;
            auVar309._8_4_ = fVar117 * auVar330._8_4_ + fVar321 * auVar291._8_4_;
            auVar309._12_4_ = fVar118 * auVar330._12_4_ + fVar323 * auVar291._12_4_;
            auVar318._0_4_ = fVar251 * auVar344._0_4_ + fVar119 * fVar287;
            auVar318._4_4_ = fVar252 * auVar344._4_4_ + fVar311 * fVar298;
            auVar318._8_4_ = fVar117 * auVar344._8_4_ + fVar321 * fVar299;
            auVar318._12_4_ = fVar118 * auVar344._12_4_ + fVar323 * fVar300;
            auVar332._0_4_ = fVar251 * auVar363._0_4_ + fVar119 * auVar355._0_4_;
            auVar332._4_4_ = fVar252 * auVar363._4_4_ + fVar311 * auVar355._4_4_;
            auVar332._8_4_ = fVar117 * auVar363._8_4_ + fVar321 * auVar355._8_4_;
            auVar332._12_4_ = fVar118 * auVar363._12_4_ + fVar323 * auVar355._12_4_;
            auVar295._0_4_ = fVar251 * fVar201 + fVar119 * auVar305._0_4_;
            auVar295._4_4_ = fVar252 * fVar228 + fVar311 * auVar305._4_4_;
            auVar295._8_4_ = fVar117 * fVar232 + fVar321 * auVar305._8_4_;
            auVar295._12_4_ = fVar118 * fVar78 + fVar323 * auVar305._12_4_;
            auVar132 = vsubps_avx(auVar318,auVar309);
            auVar167 = vsubps_avx(auVar332,auVar318);
            auVar133 = vsubps_avx(auVar295,auVar332);
            local_1f8 = vshufps_avx(auVar263,auVar263,0);
            fVar118 = local_1f8._0_4_;
            fVar119 = local_1f8._4_4_;
            fVar311 = local_1f8._8_4_;
            fVar321 = local_1f8._12_4_;
            auVar204 = vshufps_avx(ZEXT416((uint)fVar250),ZEXT416((uint)fVar250),0);
            fVar250 = auVar204._0_4_;
            fVar251 = auVar204._4_4_;
            fVar252 = auVar204._8_4_;
            fVar117 = auVar204._12_4_;
            auVar204 = vshufps_avx(auVar269,auVar269,0);
            local_368 = auVar185._0_4_;
            fStack_364 = auVar185._4_4_;
            fStack_360 = auVar185._8_4_;
            fStack_35c = auVar185._12_4_;
            auVar181 = vshufps_avx(ZEXT416((uint)fVar231),ZEXT416((uint)fVar231),0);
            local_358 = auVar153._0_4_;
            fStack_354 = auVar153._4_4_;
            fStack_350 = auVar153._8_4_;
            fStack_34c = auVar153._12_4_;
            auVar144 = vshufps_avx(ZEXT416((uint)fVar227),ZEXT416((uint)fVar227),0);
            local_348 = auVar152._0_4_;
            fStack_344 = auVar152._4_4_;
            fStack_340 = auVar152._8_4_;
            fStack_33c = auVar152._12_4_;
            auVar260._0_4_ =
                 (fVar250 * (fVar250 * auVar132._0_4_ + fVar118 * auVar167._0_4_) +
                 fVar118 * (fVar250 * auVar167._0_4_ + fVar118 * auVar133._0_4_)) * 3.0;
            auVar260._4_4_ =
                 (fVar251 * (fVar251 * auVar132._4_4_ + fVar119 * auVar167._4_4_) +
                 fVar119 * (fVar251 * auVar167._4_4_ + fVar119 * auVar133._4_4_)) * 3.0;
            auVar260._8_4_ =
                 (fVar252 * (fVar252 * auVar132._8_4_ + fVar311 * auVar167._8_4_) +
                 fVar311 * (fVar252 * auVar167._8_4_ + fVar311 * auVar133._8_4_)) * 3.0;
            auVar260._12_4_ =
                 (fVar117 * (fVar117 * auVar132._12_4_ + fVar321 * auVar167._12_4_) +
                 fVar321 * (fVar117 * auVar167._12_4_ + fVar321 * auVar133._12_4_)) * 3.0;
            auVar132 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
            local_338 = auVar151._0_4_;
            fStack_334 = auVar151._4_4_;
            fStack_330 = auVar151._8_4_;
            fStack_32c = auVar151._12_4_;
            auVar223._0_4_ =
                 auVar132._0_4_ * local_338 +
                 auVar144._0_4_ * local_348 +
                 auVar204._0_4_ * local_368 + auVar181._0_4_ * local_358;
            auVar223._4_4_ =
                 auVar132._4_4_ * fStack_334 +
                 auVar144._4_4_ * fStack_344 +
                 auVar204._4_4_ * fStack_364 + auVar181._4_4_ * fStack_354;
            auVar223._8_4_ =
                 auVar132._8_4_ * fStack_330 +
                 auVar144._8_4_ * fStack_340 +
                 auVar204._8_4_ * fStack_360 + auVar181._8_4_ * fStack_350;
            auVar223._12_4_ =
                 auVar132._12_4_ * fStack_32c +
                 auVar144._12_4_ * fStack_33c +
                 auVar204._12_4_ * fStack_35c + auVar181._12_4_ * fStack_34c;
            auVar204 = vshufps_avx(auVar260,auVar260,0xc9);
            auVar247._0_4_ = auVar223._0_4_ * auVar204._0_4_;
            auVar247._4_4_ = auVar223._4_4_ * auVar204._4_4_;
            auVar247._8_4_ = auVar223._8_4_ * auVar204._8_4_;
            auVar247._12_4_ = auVar223._12_4_ * auVar204._12_4_;
            auVar204 = vshufps_avx(auVar223,auVar223,0xc9);
            auVar224._0_4_ = auVar260._0_4_ * auVar204._0_4_;
            auVar224._4_4_ = auVar260._4_4_ * auVar204._4_4_;
            auVar224._8_4_ = auVar260._8_4_ * auVar204._8_4_;
            auVar224._12_4_ = auVar260._12_4_ * auVar204._12_4_;
            auVar204 = vsubps_avx(auVar224,auVar247);
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              *(float *)(ray + k * 4 + 0x80) = fVar202;
              uVar8 = vextractps_avx(auVar204,1);
              *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
              uVar8 = vextractps_avx(auVar204,2);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
              *(int *)(ray + k * 4 + 0xe0) = auVar204._0_4_;
              *(float *)(ray + k * 4 + 0xf0) = fVar199;
              *(float *)(ray + k * 4 + 0x100) = fVar200;
              *(uint *)(ray + k * 4 + 0x110) = uVar11;
              *(uint *)(ray + k * 4 + 0x120) = uVar71;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              auVar181 = vshufps_avx(auVar204,auVar204,0x55);
              auVar144 = vshufps_avx(auVar204,auVar204,0xaa);
              local_208 = vshufps_avx(auVar204,auVar204,0);
              local_228[0] = (RTCHitN)auVar181[0];
              local_228[1] = (RTCHitN)auVar181[1];
              local_228[2] = (RTCHitN)auVar181[2];
              local_228[3] = (RTCHitN)auVar181[3];
              local_228[4] = (RTCHitN)auVar181[4];
              local_228[5] = (RTCHitN)auVar181[5];
              local_228[6] = (RTCHitN)auVar181[6];
              local_228[7] = (RTCHitN)auVar181[7];
              local_228[8] = (RTCHitN)auVar181[8];
              local_228[9] = (RTCHitN)auVar181[9];
              local_228[10] = (RTCHitN)auVar181[10];
              local_228[0xb] = (RTCHitN)auVar181[0xb];
              local_228[0xc] = (RTCHitN)auVar181[0xc];
              local_228[0xd] = (RTCHitN)auVar181[0xd];
              local_228[0xe] = (RTCHitN)auVar181[0xe];
              local_228[0xf] = (RTCHitN)auVar181[0xf];
              local_218 = auVar144;
              local_398 = auVar191._0_8_;
              uStack_390 = auVar191._8_8_;
              local_1d8 = local_398;
              uStack_1d0 = uStack_390;
              local_1c8 = auVar161;
              vcmpps_avx(ZEXT1632(auVar161),ZEXT1632(auVar161),0xf);
              uStack_1b4 = context->user->instID[0];
              local_1b8 = uStack_1b4;
              uStack_1b0 = uStack_1b4;
              uStack_1ac = uStack_1b4;
              uStack_1a8 = context->user->instPrimID[0];
              uStack_1a4 = uStack_1a8;
              uStack_1a0 = uStack_1a8;
              uStack_19c = uStack_1a8;
              *(float *)(ray + k * 4 + 0x80) = fVar202;
              local_468 = *local_458;
              args.valid = (int *)local_468;
              args.geometryUserPtr = pGVar12->userPtr;
              args.context = context->user;
              args.hit = local_228;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar12->intersectionFilterN)(&args);
                auVar320._8_56_ = extraout_var;
                auVar320._0_8_ = extraout_XMM1_Qa;
                auVar98 = auVar320._0_16_;
              }
              if (local_468 == (undefined1  [16])0x0) {
                auVar204 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar98 = vpcmpeqd_avx(auVar98,auVar98);
                auVar204 = auVar204 ^ auVar98;
              }
              else {
                p_Var17 = context->args->filter;
                auVar98 = vpcmpeqd_avx(auVar144,auVar144);
                if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var17)(&args);
                  auVar98 = vpcmpeqd_avx(auVar98,auVar98);
                }
                auVar181 = vpcmpeqd_avx(local_468,_DAT_01f45a50);
                auVar204 = auVar181 ^ auVar98;
                if (local_468 != (undefined1  [16])0x0) {
                  auVar181 = auVar181 ^ auVar98;
                  auVar98 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])args.hit);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar98;
                  auVar98 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])(args.hit + 0x10));
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar98;
                  auVar98 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])(args.hit + 0x20));
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar98;
                  auVar98 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])(args.hit + 0x30));
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar98;
                  auVar98 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])(args.hit + 0x40));
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar98;
                  auVar98 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])(args.hit + 0x50));
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar98;
                  auVar98 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])(args.hit + 0x60));
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar98;
                  auVar98 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])(args.hit + 0x70));
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar98;
                  auVar98 = vmaskmovps_avx(auVar181,*(undefined1 (*) [16])(args.hit + 0x80));
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar98;
                }
              }
              auVar109._8_8_ = 0x100000001;
              auVar109._0_8_ = 0x100000001;
              if ((auVar109 & auVar204) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar233;
              }
            }
          }
        }
      }
      goto LAB_008b8d66;
    }
    auVar98 = vinsertps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar199),0x10);
    auVar365 = ZEXT1664(auVar98);
    auVar320 = ZEXT1664(auVar259);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }